

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Primitive PVar3;
  undefined4 uVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  bool bVar48;
  undefined1 auVar49 [32];
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  uint uVar79;
  uint uVar80;
  ulong uVar81;
  ulong uVar82;
  uint uVar83;
  long lVar84;
  undefined1 auVar85 [8];
  undefined4 uVar86;
  ulong uVar87;
  bool bVar88;
  float fVar89;
  vint4 bi_2;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 extraout_var [60];
  undefined1 auVar114 [64];
  float fVar115;
  undefined8 extraout_XMM1_Qa;
  float fVar152;
  vint4 bi_1;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar129 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar139 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  vint4 ai_2;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar173 [16];
  undefined1 auVar194 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  float fVar198;
  float fVar210;
  float fVar211;
  vint4 ai;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [28];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar205 [16];
  undefined1 auVar209 [32];
  vint4 bi;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar229 [32];
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar230 [64];
  float fVar234;
  float fVar242;
  float fVar243;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar249 [16];
  undefined1 auVar248 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  vint4 ai_1;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar260 [32];
  undefined1 auVar259 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  undefined1 auVar264 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [64];
  float fVar273;
  undefined1 auVar271 [32];
  undefined1 auVar284 [16];
  undefined1 auVar269 [16];
  float fVar274;
  undefined1 auVar272 [64];
  float fVar278;
  undefined1 auVar275 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar283 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [64];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar296;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  RTCFilterFunctionNArguments args;
  float P_err;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  undefined8 local_b20;
  undefined8 uStack_b18;
  float local_b08;
  float local_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 auStack_af0 [16];
  undefined1 local_ad0 [8];
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined8 *local_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined1 local_8b0 [16];
  Primitive *local_898;
  Primitive *local_890;
  ulong local_888;
  undefined1 local_880 [32];
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 auStack_7b0 [8];
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined4 local_700;
  undefined4 uStack_6fc;
  undefined4 uStack_6f8;
  undefined4 uStack_6f4;
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  RTCHitN local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined4 local_6c0;
  undefined4 uStack_6bc;
  undefined4 uStack_6b8;
  undefined4 uStack_6b4;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined8 local_690;
  undefined8 uStack_688;
  undefined1 local_680 [16];
  uint local_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  uint uStack_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined4 uStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var_00 [60];
  undefined1 auVar150 [64];
  undefined1 auVar258 [16];
  undefined1 auVar265 [16];
  undefined1 auVar270 [16];
  
  PVar3 = prim[1];
  uVar87 = (ulong)(byte)PVar3;
  lVar84 = uVar87 * 0x19;
  fVar89 = *(float *)(prim + lVar84 + 0x12);
  auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar97 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar202 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar202 = vinsertps_avx(auVar202,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar97 = vsubps_avx(auVar97,*(undefined1 (*) [16])(prim + lVar84 + 6));
  auVar90._0_4_ = fVar89 * auVar97._0_4_;
  auVar90._4_4_ = fVar89 * auVar97._4_4_;
  auVar90._8_4_ = fVar89 * auVar97._8_4_;
  auVar90._12_4_ = fVar89 * auVar97._12_4_;
  auVar216._0_4_ = fVar89 * auVar202._0_4_;
  auVar216._4_4_ = fVar89 * auVar202._4_4_;
  auVar216._8_4_ = fVar89 * auVar202._8_4_;
  auVar216._12_4_ = fVar89 * auVar202._12_4_;
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 5 + 6)));
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 6)));
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xb + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar284 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar284 = vcvtdq2ps_avx(auVar284);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar87 + 6)));
  auVar125 = vcvtdq2ps_avx(auVar125);
  uVar81 = (ulong)(uint)((int)(uVar87 * 9) * 2);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + uVar87 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar81 = (ulong)(uint)((int)(uVar87 * 5) << 2);
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + 6)));
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar288._4_4_ = auVar216._0_4_;
  auVar288._0_4_ = auVar216._0_4_;
  auVar288._8_4_ = auVar216._0_4_;
  auVar288._12_4_ = auVar216._0_4_;
  auVar117 = vshufps_avx(auVar216,auVar216,0x55);
  auVar91 = vshufps_avx(auVar216,auVar216,0xaa);
  fVar89 = auVar91._0_4_;
  auVar275._0_4_ = fVar89 * auVar158._0_4_;
  fVar115 = auVar91._4_4_;
  auVar275._4_4_ = fVar115 * auVar158._4_4_;
  fVar234 = auVar91._8_4_;
  auVar275._8_4_ = fVar234 * auVar158._8_4_;
  fVar151 = auVar91._12_4_;
  auVar275._12_4_ = fVar151 * auVar158._12_4_;
  auVar269._0_4_ = auVar125._0_4_ * fVar89;
  auVar269._4_4_ = auVar125._4_4_ * fVar115;
  auVar269._8_4_ = auVar125._8_4_ * fVar234;
  auVar269._12_4_ = auVar125._12_4_ * fVar151;
  auVar256._0_4_ = auVar161._0_4_ * fVar89;
  auVar256._4_4_ = auVar161._4_4_ * fVar115;
  auVar256._8_4_ = auVar161._8_4_ * fVar234;
  auVar256._12_4_ = auVar161._12_4_ * fVar151;
  auVar91 = vfmadd231ps_fma(auVar275,auVar117,auVar202);
  auVar118 = vfmadd231ps_fma(auVar269,auVar117,auVar284);
  auVar117 = vfmadd231ps_fma(auVar256,auVar92,auVar117);
  auVar173 = vfmadd231ps_fma(auVar91,auVar288,auVar97);
  auVar118 = vfmadd231ps_fma(auVar118,auVar288,auVar99);
  auVar200 = vfmadd231ps_fma(auVar117,auVar93,auVar288);
  auVar289._4_4_ = auVar90._0_4_;
  auVar289._0_4_ = auVar90._0_4_;
  auVar289._8_4_ = auVar90._0_4_;
  auVar289._12_4_ = auVar90._0_4_;
  auVar117 = vshufps_avx(auVar90,auVar90,0x55);
  auVar91 = vshufps_avx(auVar90,auVar90,0xaa);
  fVar89 = auVar91._0_4_;
  auVar217._0_4_ = fVar89 * auVar158._0_4_;
  fVar115 = auVar91._4_4_;
  auVar217._4_4_ = fVar115 * auVar158._4_4_;
  fVar234 = auVar91._8_4_;
  auVar217._8_4_ = fVar234 * auVar158._8_4_;
  fVar151 = auVar91._12_4_;
  auVar217._12_4_ = fVar151 * auVar158._12_4_;
  auVar116._0_4_ = auVar125._0_4_ * fVar89;
  auVar116._4_4_ = auVar125._4_4_ * fVar115;
  auVar116._8_4_ = auVar125._8_4_ * fVar234;
  auVar116._12_4_ = auVar125._12_4_ * fVar151;
  auVar91._0_4_ = auVar161._0_4_ * fVar89;
  auVar91._4_4_ = auVar161._4_4_ * fVar115;
  auVar91._8_4_ = auVar161._8_4_ * fVar234;
  auVar91._12_4_ = auVar161._12_4_ * fVar151;
  auVar202 = vfmadd231ps_fma(auVar217,auVar117,auVar202);
  auVar158 = vfmadd231ps_fma(auVar116,auVar117,auVar284);
  auVar284 = vfmadd231ps_fma(auVar91,auVar117,auVar92);
  auVar125 = vfmadd231ps_fma(auVar202,auVar289,auVar97);
  auVar92 = vfmadd231ps_fma(auVar158,auVar289,auVar99);
  auVar161 = vfmadd231ps_fma(auVar284,auVar289,auVar93);
  local_940._8_4_ = 0x7fffffff;
  local_940._0_8_ = 0x7fffffff7fffffff;
  local_940._12_4_ = 0x7fffffff;
  auVar97 = vandps_avx(auVar173,local_940);
  auVar199._8_4_ = 0x219392ef;
  auVar199._0_8_ = 0x219392ef219392ef;
  auVar199._12_4_ = 0x219392ef;
  auVar97 = vcmpps_avx(auVar97,auVar199,1);
  auVar202 = vblendvps_avx(auVar173,auVar199,auVar97);
  auVar97 = vandps_avx(auVar118,local_940);
  auVar97 = vcmpps_avx(auVar97,auVar199,1);
  auVar158 = vblendvps_avx(auVar118,auVar199,auVar97);
  auVar97 = vandps_avx(auVar200,local_940);
  auVar97 = vcmpps_avx(auVar97,auVar199,1);
  auVar97 = vblendvps_avx(auVar200,auVar199,auVar97);
  auVar99 = vrcpps_avx(auVar202);
  auVar248._8_4_ = 0x3f800000;
  auVar248._0_8_ = &DAT_3f8000003f800000;
  auVar248._12_4_ = 0x3f800000;
  auVar202 = vfnmadd213ps_fma(auVar202,auVar99,auVar248);
  auVar99 = vfmadd132ps_fma(auVar202,auVar99,auVar99);
  auVar202 = vrcpps_avx(auVar158);
  auVar158 = vfnmadd213ps_fma(auVar158,auVar202,auVar248);
  auVar284 = vfmadd132ps_fma(auVar158,auVar202,auVar202);
  auVar202 = vrcpps_avx(auVar97);
  auVar97 = vfnmadd213ps_fma(auVar97,auVar202,auVar248);
  auVar93 = vfmadd132ps_fma(auVar97,auVar202,auVar202);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar87 * 7 + 6);
  auVar97 = vpmovsxwd_avx(auVar97);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar125);
  auVar200._0_4_ = auVar99._0_4_ * auVar97._0_4_;
  auVar200._4_4_ = auVar99._4_4_ * auVar97._4_4_;
  auVar200._8_4_ = auVar99._8_4_ * auVar97._8_4_;
  auVar200._12_4_ = auVar99._12_4_ * auVar97._12_4_;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar87 * 9 + 6);
  auVar97 = vpmovsxwd_avx(auVar202);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar125);
  auVar218._0_4_ = auVar99._0_4_ * auVar97._0_4_;
  auVar218._4_4_ = auVar99._4_4_ * auVar97._4_4_;
  auVar218._8_4_ = auVar99._8_4_ * auVar97._8_4_;
  auVar218._12_4_ = auVar99._12_4_ * auVar97._12_4_;
  auVar118._1_3_ = 0;
  auVar118[0] = PVar3;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar202 = vpmovsxwd_avx(auVar158);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar87 * -2 + 6);
  auVar97 = vpmovsxwd_avx(auVar99);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar92);
  auVar257._0_4_ = auVar97._0_4_ * auVar284._0_4_;
  auVar257._4_4_ = auVar97._4_4_ * auVar284._4_4_;
  auVar257._8_4_ = auVar97._8_4_ * auVar284._8_4_;
  auVar257._12_4_ = auVar97._12_4_ * auVar284._12_4_;
  auVar97 = vcvtdq2ps_avx(auVar202);
  auVar97 = vsubps_avx(auVar97,auVar92);
  auVar117._0_4_ = auVar284._0_4_ * auVar97._0_4_;
  auVar117._4_4_ = auVar284._4_4_ * auVar97._4_4_;
  auVar117._8_4_ = auVar284._8_4_ * auVar97._8_4_;
  auVar117._12_4_ = auVar284._12_4_ * auVar97._12_4_;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = *(ulong *)(prim + uVar81 + uVar87 + 6);
  auVar97 = vpmovsxwd_avx(auVar284);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar161);
  auVar173._0_4_ = auVar93._0_4_ * auVar97._0_4_;
  auVar173._4_4_ = auVar93._4_4_ * auVar97._4_4_;
  auVar173._8_4_ = auVar93._8_4_ * auVar97._8_4_;
  auVar173._12_4_ = auVar93._12_4_ * auVar97._12_4_;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *(ulong *)(prim + uVar87 * 0x17 + 6);
  auVar97 = vpmovsxwd_avx(auVar125);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar161);
  auVar92._0_4_ = auVar93._0_4_ * auVar97._0_4_;
  auVar92._4_4_ = auVar93._4_4_ * auVar97._4_4_;
  auVar92._8_4_ = auVar93._8_4_ * auVar97._8_4_;
  auVar92._12_4_ = auVar93._12_4_ * auVar97._12_4_;
  auVar97 = vpminsd_avx(auVar200,auVar218);
  auVar202 = vpminsd_avx(auVar257,auVar117);
  auVar97 = vmaxps_avx(auVar97,auVar202);
  auVar202 = vpminsd_avx(auVar173,auVar92);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar264._4_4_ = uVar1;
  auVar264._0_4_ = uVar1;
  auVar264._8_4_ = uVar1;
  auVar264._12_4_ = uVar1;
  auVar202 = vmaxps_avx(auVar202,auVar264);
  auVar97 = vmaxps_avx(auVar97,auVar202);
  local_4b0._0_4_ = auVar97._0_4_ * 0.99999964;
  local_4b0._4_4_ = auVar97._4_4_ * 0.99999964;
  local_4b0._8_4_ = auVar97._8_4_ * 0.99999964;
  local_4b0._12_4_ = auVar97._12_4_ * 0.99999964;
  auVar97 = vpmaxsd_avx(auVar200,auVar218);
  auVar202 = vpmaxsd_avx(auVar257,auVar117);
  auVar97 = vminps_avx(auVar97,auVar202);
  auVar202 = vpmaxsd_avx(auVar173,auVar92);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar161._4_4_ = uVar1;
  auVar161._0_4_ = uVar1;
  auVar161._8_4_ = uVar1;
  auVar161._12_4_ = uVar1;
  auVar202 = vminps_avx(auVar202,auVar161);
  auVar97 = vminps_avx(auVar97,auVar202);
  auVar93._0_4_ = auVar97._0_4_ * 1.0000004;
  auVar93._4_4_ = auVar97._4_4_ * 1.0000004;
  auVar93._8_4_ = auVar97._8_4_ * 1.0000004;
  auVar93._12_4_ = auVar97._12_4_ * 1.0000004;
  auVar118[4] = PVar3;
  auVar118._5_3_ = 0;
  auVar118[8] = PVar3;
  auVar118._9_3_ = 0;
  auVar118[0xc] = PVar3;
  auVar118._13_3_ = 0;
  auVar202 = vpcmpgtd_avx(auVar118,_DAT_01ff0cf0);
  auVar97 = vcmpps_avx(local_4b0,auVar93,2);
  auVar97 = vandps_avx(auVar97,auVar202);
  uVar83 = vmovmskps_avx(auVar97);
  if (uVar83 == 0) {
    return;
  }
  uVar83 = uVar83 & 0xff;
  local_898 = prim + lVar84 + 0x16;
  auVar103._16_16_ = mm_lookupmask_ps._240_16_;
  auVar103._0_16_ = mm_lookupmask_ps._240_16_;
  local_480 = vblendps_avx(auVar103,ZEXT832(0) << 0x20,0x80);
  local_9a8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_860 = 0x7fffffff;
  uStack_85c = 0x7fffffff;
  uStack_858 = 0x7fffffff;
  uStack_854 = 0x7fffffff;
  uStack_850 = 0x7fffffff;
  uStack_84c = 0x7fffffff;
  uStack_848 = 0x7fffffff;
  uStack_844 = 0x7fffffff;
  local_890 = prim;
LAB_01637ee9:
  lVar84 = 0;
  local_888 = (ulong)uVar83;
  for (uVar87 = local_888; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
    lVar84 = lVar84 + 1;
  }
  local_888 = local_888 - 1 & local_888;
  uVar1 = *(undefined4 *)(local_890 + lVar84 * 4 + 6);
  uVar87 = (ulong)(uint)((int)lVar84 << 6);
  auVar97 = *(undefined1 (*) [16])(local_898 + uVar87);
  if (local_888 != 0) {
    uVar82 = local_888 - 1 & local_888;
    for (uVar81 = local_888; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    }
    if (uVar82 != 0) {
      for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar202 = *(undefined1 (*) [16])(local_898 + uVar87 + 0x10);
  auVar158 = *(undefined1 (*) [16])(local_898 + uVar87 + 0x20);
  auVar99 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar125 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar86 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar258._4_4_ = uVar86;
  auVar258._0_4_ = uVar86;
  auVar258._8_4_ = uVar86;
  auVar258._12_4_ = uVar86;
  fStack_7d0 = (float)uVar86;
  _local_7e0 = auVar258;
  fStack_7cc = (float)uVar86;
  fStack_7c8 = (float)uVar86;
  register0x0000141c = uVar86;
  auVar263 = ZEXT3264(_local_7e0);
  auVar99 = *(undefined1 (*) [16])(local_898 + uVar87 + 0x30);
  uVar86 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar265._4_4_ = uVar86;
  auVar265._0_4_ = uVar86;
  auVar265._8_4_ = uVar86;
  auVar265._12_4_ = uVar86;
  fStack_7f0 = (float)uVar86;
  _local_800 = auVar265;
  fStack_7ec = (float)uVar86;
  fStack_7e8 = (float)uVar86;
  register0x0000145c = uVar86;
  auVar268 = ZEXT3264(_local_800);
  auVar284 = vunpcklps_avx(auVar258,auVar265);
  fVar89 = *(float *)(ray + k * 4 + 0x60);
  auVar270._4_4_ = fVar89;
  auVar270._0_4_ = fVar89;
  auVar270._8_4_ = fVar89;
  auVar270._12_4_ = fVar89;
  fStack_830 = fVar89;
  _local_840 = auVar270;
  fStack_82c = fVar89;
  fStack_828 = fVar89;
  uStack_824 = fVar89;
  auVar272 = ZEXT3264(_local_840);
  local_930 = vinsertps_avx(auVar284,auVar270,0x28);
  auVar276 = ZEXT1664(local_930);
  auVar219._0_4_ = (auVar97._0_4_ + auVar202._0_4_ + auVar158._0_4_ + auVar99._0_4_) * 0.25;
  auVar219._4_4_ = (auVar97._4_4_ + auVar202._4_4_ + auVar158._4_4_ + auVar99._4_4_) * 0.25;
  auVar219._8_4_ = (auVar97._8_4_ + auVar202._8_4_ + auVar158._8_4_ + auVar99._8_4_) * 0.25;
  auVar219._12_4_ = (auVar97._12_4_ + auVar202._12_4_ + auVar158._12_4_ + auVar99._12_4_) * 0.25;
  auVar284 = vsubps_avx(auVar219,auVar125);
  auVar284 = vdpps_avx(auVar284,local_930,0x7f);
  local_950 = vdpps_avx(local_930,local_930,0x7f);
  uVar83 = *(uint *)(local_890 + 2);
  auVar93 = vrcpss_avx(local_950,local_950);
  auVar92 = vfnmadd213ss_fma(auVar93,local_950,ZEXT416(0x40000000));
  auVar255 = ZEXT1664(auVar92);
  local_380 = auVar284._0_4_ * auVar93._0_4_ * auVar92._0_4_;
  auVar230 = ZEXT464((uint)local_380);
  auVar235._4_4_ = local_380;
  auVar235._0_4_ = local_380;
  auVar235._8_4_ = local_380;
  auVar235._12_4_ = local_380;
  fStack_790 = local_380;
  _local_7a0 = auVar235;
  fStack_78c = local_380;
  fStack_788 = local_380;
  fStack_784 = local_380;
  auVar284 = vfmadd231ps_fma(auVar125,local_930,auVar235);
  auVar284 = vblendps_avx(auVar284,_DAT_01feba10,8);
  local_aa0 = vsubps_avx(auVar97,auVar284);
  local_ab0 = vsubps_avx(auVar158,auVar284);
  local_ac0 = vsubps_avx(auVar202,auVar284);
  _local_ad0 = vsubps_avx(auVar99,auVar284);
  auVar197 = ZEXT1664(_local_ad0);
  auVar97 = vmovshdup_avx(local_aa0);
  local_1a0 = auVar97._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar97 = vshufps_avx(local_aa0,local_aa0,0xaa);
  local_1c0 = auVar97._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar97 = vshufps_avx(local_aa0,local_aa0,0xff);
  local_1e0 = auVar97._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar97 = vmovshdup_avx(local_ac0);
  local_200 = auVar97._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar97 = vshufps_avx(local_ac0,local_ac0,0xaa);
  local_220 = auVar97._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar97 = vshufps_avx(local_ac0,local_ac0,0xff);
  local_240 = auVar97._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar97 = vmovshdup_avx(local_ab0);
  local_440 = auVar97._0_4_;
  fStack_43c = auVar97._4_4_;
  auVar97 = vshufps_avx(local_ab0,local_ab0,0xaa);
  local_460 = auVar97._0_4_;
  fStack_45c = auVar97._4_4_;
  auVar97 = vshufps_avx(local_ab0,local_ab0,0xff);
  local_260 = auVar97._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar97 = vmovshdup_avx(_local_ad0);
  local_280 = auVar97._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar97 = vshufps_avx(_local_ad0,_local_ad0,0xaa);
  local_2a0 = auVar97._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar97 = vshufps_avx(_local_ad0,_local_ad0,0xff);
  local_2c0 = auVar97._0_8_;
  uStack_2b8 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2a8 = local_2c0;
  auVar97 = vfmadd231ps_fma(ZEXT432((uint)(fVar89 * fVar89)),_local_800,_local_800);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),_local_7e0,_local_7e0);
  uVar86 = auVar97._0_4_;
  local_2e0._4_4_ = uVar86;
  local_2e0._0_4_ = uVar86;
  local_2e0._8_4_ = uVar86;
  local_2e0._12_4_ = uVar86;
  local_2e0._16_4_ = uVar86;
  local_2e0._20_4_ = uVar86;
  local_2e0._24_4_ = uVar86;
  local_2e0._28_4_ = uVar86;
  fVar89 = *(float *)(ray + k * 4 + 0x30);
  local_8b0 = ZEXT416((uint)local_380);
  local_380 = fVar89 - local_380;
  fStack_37c = local_380;
  fStack_378 = local_380;
  fStack_374 = local_380;
  fStack_370 = local_380;
  fStack_36c = local_380;
  fStack_368 = local_380;
  fStack_364 = local_380;
  uVar87 = 1;
  uVar81 = 0;
  local_300 = local_aa0._0_4_;
  uStack_2fc = local_300;
  uStack_2f8 = local_300;
  uStack_2f4 = local_300;
  uStack_2f0 = local_300;
  uStack_2ec = local_300;
  uStack_2e8 = local_300;
  uStack_2e4 = local_300;
  local_320 = local_ac0._0_4_;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_340 = local_ab0._0_4_;
  fStack_33c = local_340;
  fStack_338 = local_340;
  fStack_334 = local_340;
  fStack_330 = local_340;
  fStack_32c = local_340;
  fStack_328 = local_340;
  fStack_324 = local_340;
  local_360 = local_ad0._0_4_;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  auVar111._4_4_ = uStack_85c;
  auVar111._0_4_ = local_860;
  auVar111._8_4_ = uStack_858;
  auVar111._12_4_ = uStack_854;
  auVar111._16_4_ = uStack_850;
  auVar111._20_4_ = uStack_84c;
  auVar111._24_4_ = uStack_848;
  auVar111._28_4_ = uStack_844;
  local_4a0 = vandps_avx(local_2e0,auVar111);
  auVar97 = vsqrtss_avx(local_950,local_950);
  local_b04 = auVar97._0_4_;
  auVar97 = vsqrtss_avx(local_950,local_950);
  local_b08 = auVar97._0_4_;
  local_8c0 = 0x3f80000000000000;
  uStack_8b8 = 0;
  local_700 = uVar1;
  uStack_6fc = uVar1;
  uStack_6f8 = uVar1;
  uStack_6f4 = uVar1;
  local_6f0 = uVar83;
  uStack_6ec = uVar83;
  uStack_6e8 = uVar83;
  uStack_6e4 = uVar83;
  fStack_458 = local_460;
  fStack_454 = fStack_45c;
  fStack_450 = local_460;
  fStack_44c = fStack_45c;
  fStack_448 = local_460;
  fStack_444 = fStack_45c;
  fStack_438 = local_440;
  fStack_434 = fStack_43c;
  fStack_430 = local_440;
  fStack_42c = fStack_43c;
  fStack_428 = local_440;
  fStack_424 = fStack_43c;
  do {
    auVar60._8_8_ = uStack_8b8;
    auVar60._0_8_ = local_8c0;
    auVar97 = vmovshdup_avx(auVar60);
    local_900._0_4_ = (float)local_8c0;
    fVar11 = auVar97._0_4_ - local_900._0_4_;
    fVar156 = fVar11 * 0.04761905;
    local_900._4_4_ = local_900._0_4_;
    local_900._8_4_ = local_900._0_4_;
    local_900._12_4_ = local_900._0_4_;
    local_900._16_4_ = local_900._0_4_;
    local_900._20_4_ = local_900._0_4_;
    local_900._24_4_ = local_900._0_4_;
    local_900._28_4_ = local_900._0_4_;
    local_920._4_4_ = fVar11;
    local_920._0_4_ = fVar11;
    local_920._8_4_ = fVar11;
    local_920._12_4_ = fVar11;
    local_920._16_4_ = fVar11;
    local_920._20_4_ = fVar11;
    local_920._24_4_ = fVar11;
    local_920._28_4_ = fVar11;
    auVar97 = vfmadd231ps_fma(local_900,local_920,_DAT_02020f20);
    auVar294._8_4_ = 0x3f800000;
    auVar294._0_8_ = &DAT_3f8000003f800000;
    auVar294._12_4_ = 0x3f800000;
    auVar294._16_4_ = 0x3f800000;
    auVar294._20_4_ = 0x3f800000;
    auVar294._24_4_ = 0x3f800000;
    auVar294._28_4_ = 0x3f800000;
    auVar103 = vsubps_avx(auVar294,ZEXT1632(auVar97));
    auVar69._4_4_ = fStack_31c;
    auVar69._0_4_ = local_320;
    auVar69._8_4_ = fStack_318;
    auVar69._12_4_ = fStack_314;
    auVar69._16_4_ = fStack_310;
    auVar69._20_4_ = fStack_30c;
    auVar69._24_4_ = fStack_308;
    auVar69._28_4_ = fStack_304;
    fVar115 = auVar97._0_4_;
    auVar277._0_4_ = local_320 * fVar115;
    fVar234 = auVar97._4_4_;
    auVar277._4_4_ = fStack_31c * fVar234;
    fVar151 = auVar97._8_4_;
    auVar277._8_4_ = fStack_318 * fVar151;
    fVar242 = auVar97._12_4_;
    auVar277._12_4_ = fStack_314 * fVar242;
    auVar277._16_4_ = fStack_310 * 0.0;
    auVar277._20_4_ = fStack_30c * 0.0;
    auVar277._28_36_ = auVar276._28_36_;
    auVar277._24_4_ = fStack_308 * 0.0;
    auVar74._8_8_ = uStack_1f8;
    auVar74._0_8_ = local_200;
    auVar74._16_8_ = uStack_1f0;
    auVar74._24_8_ = uStack_1e8;
    auVar287._0_4_ = (float)local_200 * fVar115;
    auVar287._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar234;
    auVar287._8_4_ = (float)uStack_1f8 * fVar151;
    auVar287._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar242;
    auVar287._16_4_ = (float)uStack_1f0 * 0.0;
    auVar287._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar287._28_36_ = auVar272._28_36_;
    auVar287._24_4_ = (float)uStack_1e8 * 0.0;
    auVar73._8_8_ = uStack_218;
    auVar73._0_8_ = local_220;
    auVar73._16_8_ = uStack_210;
    auVar73._24_8_ = uStack_208;
    auVar276._0_4_ = (float)local_220 * fVar115;
    auVar276._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar234;
    auVar276._8_4_ = (float)uStack_218 * fVar151;
    auVar276._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar242;
    auVar276._16_4_ = (float)uStack_210 * 0.0;
    auVar276._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar276._28_36_ = auVar268._28_36_;
    auVar276._24_4_ = (float)uStack_208 * 0.0;
    auVar72._8_8_ = uStack_238;
    auVar72._0_8_ = local_240;
    auVar72._16_8_ = uStack_230;
    auVar72._24_8_ = uStack_228;
    auVar268._0_4_ = (float)local_240 * fVar115;
    auVar268._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar234;
    auVar268._8_4_ = (float)uStack_238 * fVar151;
    auVar268._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar242;
    auVar268._16_4_ = (float)uStack_230 * 0.0;
    auVar268._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    auVar268._28_36_ = auVar255._28_36_;
    auVar268._24_4_ = (float)uStack_228 * 0.0;
    auVar70._4_4_ = uStack_2fc;
    auVar70._0_4_ = local_300;
    auVar70._8_4_ = uStack_2f8;
    auVar70._12_4_ = uStack_2f4;
    auVar70._16_4_ = uStack_2f0;
    auVar70._20_4_ = uStack_2ec;
    auVar70._24_4_ = uStack_2e8;
    auVar70._28_4_ = uStack_2e4;
    auVar97 = vfmadd231ps_fma(auVar277._0_32_,auVar103,auVar70);
    auVar77._8_8_ = uStack_198;
    auVar77._0_8_ = local_1a0;
    auVar77._16_8_ = uStack_190;
    auVar77._24_8_ = uStack_188;
    auVar202 = vfmadd231ps_fma(auVar287._0_32_,auVar103,auVar77);
    auVar76._8_8_ = uStack_1b8;
    auVar76._0_8_ = local_1c0;
    auVar76._16_8_ = uStack_1b0;
    auVar76._24_8_ = uStack_1a8;
    auVar158 = vfmadd231ps_fma(auVar276._0_32_,auVar103,auVar76);
    auVar75._8_8_ = uStack_1d8;
    auVar75._0_8_ = local_1e0;
    auVar75._16_8_ = uStack_1d0;
    auVar75._24_8_ = uStack_1c8;
    auVar99 = vfmadd231ps_fma(auVar268._0_32_,auVar103,auVar75);
    auVar68._4_4_ = fStack_33c;
    auVar68._0_4_ = local_340;
    auVar68._8_4_ = fStack_338;
    auVar68._12_4_ = fStack_334;
    auVar68._16_4_ = fStack_330;
    auVar68._20_4_ = fStack_32c;
    auVar68._24_4_ = fStack_328;
    auVar68._28_4_ = fStack_324;
    auVar272._0_4_ = local_340 * fVar115;
    auVar272._4_4_ = fStack_33c * fVar234;
    auVar272._8_4_ = fStack_338 * fVar151;
    auVar272._12_4_ = fStack_334 * fVar242;
    auVar272._16_4_ = fStack_330 * 0.0;
    auVar272._20_4_ = fStack_32c * 0.0;
    auVar272._28_36_ = auVar263._28_36_;
    auVar272._24_4_ = fStack_328 * 0.0;
    auVar255._0_4_ = fVar115 * local_440;
    auVar255._4_4_ = fVar234 * fStack_43c;
    auVar255._8_4_ = fVar151 * fStack_438;
    auVar255._12_4_ = fVar242 * fStack_434;
    auVar255._16_4_ = fStack_430 * 0.0;
    auVar255._20_4_ = fStack_42c * 0.0;
    auVar255._28_36_ = auVar230._28_36_;
    auVar255._24_4_ = fStack_428 * 0.0;
    auVar78._4_4_ = fVar234 * fStack_45c;
    auVar78._0_4_ = fVar115 * local_460;
    auVar78._8_4_ = fVar151 * fStack_458;
    auVar78._12_4_ = fVar242 * fStack_454;
    auVar78._16_4_ = fStack_450 * 0.0;
    auVar78._20_4_ = fStack_44c * 0.0;
    auVar78._24_4_ = fStack_448 * 0.0;
    auVar78._28_4_ = DAT_02020f20._28_4_;
    auVar71._8_8_ = uStack_258;
    auVar71._0_8_ = local_260;
    auVar71._16_8_ = uStack_250;
    auVar71._24_8_ = uStack_248;
    auVar230._0_4_ = (float)local_260 * fVar115;
    auVar230._4_4_ = (float)((ulong)local_260 >> 0x20) * fVar234;
    auVar230._8_4_ = (float)uStack_258 * fVar151;
    auVar230._12_4_ = (float)((ulong)uStack_258 >> 0x20) * fVar242;
    auVar230._16_4_ = (float)uStack_250 * 0.0;
    auVar230._20_4_ = (float)((ulong)uStack_250 >> 0x20) * 0.0;
    auVar230._28_36_ = auVar197._28_36_;
    auVar230._24_4_ = (float)uStack_248 * 0.0;
    auVar284 = vfmadd231ps_fma(auVar272._0_32_,auVar103,auVar69);
    auVar125 = vfmadd231ps_fma(auVar255._0_32_,auVar103,auVar74);
    auVar93 = vfmadd231ps_fma(auVar78,auVar103,auVar73);
    auVar92 = vfmadd231ps_fma(auVar230._0_32_,auVar103,auVar72);
    auVar9._4_4_ = fVar234 * fStack_35c;
    auVar9._0_4_ = fVar115 * local_360;
    auVar9._8_4_ = fVar151 * fStack_358;
    auVar9._12_4_ = fVar242 * fStack_354;
    auVar9._16_4_ = fStack_350 * 0.0;
    auVar9._20_4_ = fStack_34c * 0.0;
    auVar9._24_4_ = fStack_348 * 0.0;
    auVar9._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar165._4_4_ = fVar234 * local_280._4_4_;
    auVar165._0_4_ = fVar115 * (float)local_280;
    auVar165._8_4_ = fVar151 * (float)uStack_278;
    auVar165._12_4_ = fVar242 * uStack_278._4_4_;
    auVar165._16_4_ = (float)uStack_270 * 0.0;
    auVar165._20_4_ = uStack_270._4_4_ * 0.0;
    auVar165._24_4_ = (float)uStack_268 * 0.0;
    auVar165._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar163._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar163._0_28_ =
         ZEXT1628(CONCAT412(auVar284._12_4_ * fVar242,
                            CONCAT48(auVar284._8_4_ * fVar151,
                                     CONCAT44(auVar284._4_4_ * fVar234,auVar284._0_4_ * fVar115))));
    auVar97 = vfmadd231ps_fma(auVar163,auVar103,ZEXT1632(auVar97));
    auVar202 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar242 * auVar125._12_4_,
                                                  CONCAT48(fVar151 * auVar125._8_4_,
                                                           CONCAT44(fVar234 * auVar125._4_4_,
                                                                    fVar115 * auVar125._0_4_)))),
                               auVar103,ZEXT1632(auVar202));
    auVar158 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar242 * auVar93._12_4_,
                                                  CONCAT48(fVar151 * auVar93._8_4_,
                                                           CONCAT44(fVar234 * auVar93._4_4_,
                                                                    fVar115 * auVar93._0_4_)))),
                               auVar103,ZEXT1632(auVar158));
    auVar99 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar242 * auVar92._12_4_,
                                                 CONCAT48(fVar151 * auVar92._8_4_,
                                                          CONCAT44(fVar234 * auVar92._4_4_,
                                                                   fVar115 * auVar92._0_4_)))),
                              auVar103,ZEXT1632(auVar99));
    auVar250._0_4_ = fVar115 * (float)local_2a0;
    auVar250._4_4_ = fVar234 * local_2a0._4_4_;
    auVar250._8_4_ = fVar151 * (float)uStack_298;
    auVar250._12_4_ = fVar242 * uStack_298._4_4_;
    auVar250._16_4_ = (float)uStack_290 * 0.0;
    auVar250._20_4_ = uStack_290._4_4_ * 0.0;
    auVar250._24_4_ = (float)uStack_288 * 0.0;
    auVar250._28_4_ = 0;
    auVar161 = vfmadd231ps_fma(auVar9,auVar103,auVar68);
    auVar284 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar161._12_4_ * fVar242,
                                                  CONCAT48(auVar161._8_4_ * fVar151,
                                                           CONCAT44(auVar161._4_4_ * fVar234,
                                                                    auVar161._0_4_ * fVar115)))),
                               auVar103,ZEXT1632(auVar284));
    auVar260._0_4_ = fVar115 * (float)local_2c0;
    auVar260._4_4_ = fVar234 * local_2c0._4_4_;
    auVar260._8_4_ = fVar151 * (float)uStack_2b8;
    auVar260._12_4_ = fVar242 * uStack_2b8._4_4_;
    auVar260._16_4_ = (float)uStack_2b0 * 0.0;
    auVar260._20_4_ = uStack_2b0._4_4_ * 0.0;
    auVar260._24_4_ = (float)uStack_2a8 * 0.0;
    auVar260._28_4_ = 0;
    auVar188._4_4_ = fStack_43c;
    auVar188._0_4_ = local_440;
    auVar188._8_4_ = fStack_438;
    auVar188._12_4_ = fStack_434;
    auVar188._16_4_ = fStack_430;
    auVar188._20_4_ = fStack_42c;
    auVar188._24_4_ = fStack_428;
    auVar188._28_4_ = fStack_424;
    auVar161 = vfmadd231ps_fma(auVar165,auVar103,auVar188);
    auVar12._4_4_ = fStack_45c;
    auVar12._0_4_ = local_460;
    auVar12._8_4_ = fStack_458;
    auVar12._12_4_ = fStack_454;
    auVar12._16_4_ = fStack_450;
    auVar12._20_4_ = fStack_44c;
    auVar12._24_4_ = fStack_448;
    auVar12._28_4_ = fStack_444;
    auVar117 = vfmadd231ps_fma(auVar250,auVar103,auVar12);
    auVar91 = vfmadd231ps_fma(auVar260,auVar103,auVar71);
    auVar193._28_4_ = fStack_324;
    auVar193._0_28_ =
         ZEXT1628(CONCAT412(auVar91._12_4_ * fVar242,
                            CONCAT48(auVar91._8_4_ * fVar151,
                                     CONCAT44(auVar91._4_4_ * fVar234,auVar91._0_4_ * fVar115))));
    auVar125 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar161._12_4_ * fVar242,
                                                  CONCAT48(auVar161._8_4_ * fVar151,
                                                           CONCAT44(auVar161._4_4_ * fVar234,
                                                                    auVar161._0_4_ * fVar115)))),
                               auVar103,ZEXT1632(auVar125));
    auVar93 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar242 * auVar117._12_4_,
                                                 CONCAT48(fVar151 * auVar117._8_4_,
                                                          CONCAT44(fVar234 * auVar117._4_4_,
                                                                   fVar115 * auVar117._0_4_)))),
                              auVar103,ZEXT1632(auVar93));
    auVar92 = vfmadd231ps_fma(auVar193,auVar103,ZEXT1632(auVar92));
    auVar10._28_4_ = (int)((ulong)uStack_248 >> 0x20);
    auVar10._0_28_ =
         ZEXT1628(CONCAT412(auVar125._12_4_ * fVar242,
                            CONCAT48(auVar125._8_4_ * fVar151,
                                     CONCAT44(auVar125._4_4_ * fVar234,auVar125._0_4_ * fVar115))));
    auVar191._28_4_ = fStack_304;
    auVar191._0_28_ =
         ZEXT1628(CONCAT412(auVar92._12_4_ * fVar242,
                            CONCAT48(auVar92._8_4_ * fVar151,
                                     CONCAT44(auVar92._4_4_ * fVar234,auVar92._0_4_ * fVar115))));
    auVar161 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar284._12_4_ * fVar242,
                                                  CONCAT48(auVar284._8_4_ * fVar151,
                                                           CONCAT44(auVar284._4_4_ * fVar234,
                                                                    auVar284._0_4_ * fVar115)))),
                               auVar103,ZEXT1632(auVar97));
    auVar117 = vfmadd231ps_fma(auVar10,auVar103,ZEXT1632(auVar202));
    auVar91 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar242 * auVar93._12_4_,
                                                 CONCAT48(fVar151 * auVar93._8_4_,
                                                          CONCAT44(fVar234 * auVar93._4_4_,
                                                                   fVar115 * auVar93._0_4_)))),
                              auVar103,ZEXT1632(auVar158));
    auVar118 = vfmadd231ps_fma(auVar191,ZEXT1632(auVar99),auVar103);
    auVar111 = vsubps_avx(ZEXT1632(auVar284),ZEXT1632(auVar97));
    auVar103 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar202));
    auVar8 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar158));
    auVar9 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar99));
    fVar234 = fVar156 * auVar111._0_4_ * 3.0;
    fVar242 = fVar156 * auVar111._4_4_ * 3.0;
    local_720._4_4_ = fVar242;
    local_720._0_4_ = fVar234;
    fVar243 = fVar156 * auVar111._8_4_ * 3.0;
    local_720._8_4_ = fVar243;
    fVar244 = fVar156 * auVar111._12_4_ * 3.0;
    local_720._12_4_ = fVar244;
    fVar245 = fVar156 * auVar111._16_4_ * 3.0;
    local_720._16_4_ = fVar245;
    fVar246 = fVar156 * auVar111._20_4_ * 3.0;
    local_720._20_4_ = fVar246;
    fVar247 = fVar156 * auVar111._24_4_ * 3.0;
    local_720._24_4_ = fVar247;
    local_720._28_4_ = auVar8._28_4_;
    local_a00._0_4_ = fVar156 * auVar103._0_4_ * 3.0;
    local_a00._4_4_ = fVar156 * auVar103._4_4_ * 3.0;
    local_a00._8_4_ = fVar156 * auVar103._8_4_ * 3.0;
    local_a00._12_4_ = fVar156 * auVar103._12_4_ * 3.0;
    local_a00._16_4_ = fVar156 * auVar103._16_4_ * 3.0;
    local_a00._20_4_ = fVar156 * auVar103._20_4_ * 3.0;
    local_a00._24_4_ = fVar156 * auVar103._24_4_ * 3.0;
    local_a00._28_4_ = 0;
    local_9a0._0_4_ = fVar156 * auVar8._0_4_ * 3.0;
    local_9a0._4_4_ = fVar156 * auVar8._4_4_ * 3.0;
    local_9a0._8_4_ = fVar156 * auVar8._8_4_ * 3.0;
    local_9a0._12_4_ = fVar156 * auVar8._12_4_ * 3.0;
    local_9a0._16_4_ = fVar156 * auVar8._16_4_ * 3.0;
    local_9a0._20_4_ = fVar156 * auVar8._20_4_ * 3.0;
    local_9a0._24_4_ = fVar156 * auVar8._24_4_ * 3.0;
    local_9a0._28_4_ = 0;
    fVar115 = fVar156 * auVar9._0_4_ * 3.0;
    fVar151 = fVar156 * auVar9._4_4_ * 3.0;
    auVar14._4_4_ = fVar151;
    auVar14._0_4_ = fVar115;
    fVar152 = fVar156 * auVar9._8_4_ * 3.0;
    auVar14._8_4_ = fVar152;
    fVar153 = fVar156 * auVar9._12_4_ * 3.0;
    auVar14._12_4_ = fVar153;
    fVar154 = fVar156 * auVar9._16_4_ * 3.0;
    auVar14._16_4_ = fVar154;
    fVar155 = fVar156 * auVar9._20_4_ * 3.0;
    auVar14._20_4_ = fVar155;
    fVar156 = fVar156 * auVar9._24_4_ * 3.0;
    auVar14._24_4_ = fVar156;
    auVar14._28_4_ = auVar111._28_4_;
    auVar188 = ZEXT1632(auVar161);
    _local_b00 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar161));
    auVar12 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar117));
    local_9e0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar91));
    local_560 = vsubps_avx(_local_b00,auVar188);
    local_540 = vsubps_avx(local_9e0,ZEXT1632(auVar91));
    fVar211 = local_540._0_4_;
    fVar212 = local_540._4_4_;
    auVar13._4_4_ = fVar212 * fVar242;
    auVar13._0_4_ = fVar211 * fVar234;
    fVar213 = local_540._8_4_;
    auVar13._8_4_ = fVar213 * fVar243;
    fVar214 = local_540._12_4_;
    auVar13._12_4_ = fVar214 * fVar244;
    fVar215 = local_540._16_4_;
    auVar13._16_4_ = fVar215 * fVar245;
    fVar273 = local_540._20_4_;
    auVar13._20_4_ = fVar273 * fVar246;
    fVar274 = local_540._24_4_;
    auVar13._24_4_ = fVar274 * fVar247;
    auVar13._28_4_ = local_9e0._28_4_;
    auVar97 = vfmsub231ps_fma(auVar13,local_9a0,local_560);
    local_580 = vsubps_avx(auVar12,ZEXT1632(auVar117));
    fVar245 = local_560._0_4_;
    fVar170 = local_560._4_4_;
    auVar271._4_4_ = fVar170 * local_a00._4_4_;
    auVar271._0_4_ = fVar245 * (float)local_a00._0_4_;
    fVar171 = local_560._8_4_;
    auVar271._8_4_ = fVar171 * local_a00._8_4_;
    fVar172 = local_560._12_4_;
    auVar271._12_4_ = fVar172 * local_a00._12_4_;
    fVar231 = local_560._16_4_;
    auVar271._16_4_ = fVar231 * local_a00._16_4_;
    fVar232 = local_560._20_4_;
    auVar271._20_4_ = fVar232 * local_a00._20_4_;
    fVar233 = local_560._24_4_;
    auVar271._24_4_ = fVar233 * local_a00._24_4_;
    auVar271._28_4_ = local_b00._28_4_;
    auVar202 = vfmsub231ps_fma(auVar271,local_720,local_580);
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar202._12_4_ * auVar202._12_4_,
                                                 CONCAT48(auVar202._8_4_ * auVar202._8_4_,
                                                          CONCAT44(auVar202._4_4_ * auVar202._4_4_,
                                                                   auVar202._0_4_ * auVar202._0_4_))
                                                )),ZEXT1632(auVar97),ZEXT1632(auVar97));
    fVar198 = local_580._0_4_;
    fVar210 = local_580._4_4_;
    auVar285._4_4_ = fVar210 * local_9a0._4_4_;
    auVar285._0_4_ = fVar198 * (float)local_9a0._0_4_;
    fVar278 = local_580._8_4_;
    auVar285._8_4_ = fVar278 * local_9a0._8_4_;
    fVar279 = local_580._12_4_;
    auVar285._12_4_ = fVar279 * local_9a0._12_4_;
    fVar280 = local_580._16_4_;
    auVar285._16_4_ = fVar280 * local_9a0._16_4_;
    fVar281 = local_580._20_4_;
    auVar285._20_4_ = fVar281 * local_9a0._20_4_;
    fVar282 = local_580._24_4_;
    auVar285._24_4_ = fVar282 * local_9a0._24_4_;
    auVar285._28_4_ = auVar12._28_4_;
    auVar158 = vfmsub231ps_fma(auVar285,local_a00,local_540);
    auVar189._0_4_ = fVar211 * fVar211;
    auVar189._4_4_ = fVar212 * fVar212;
    auVar189._8_4_ = fVar213 * fVar213;
    auVar189._12_4_ = fVar214 * fVar214;
    auVar189._16_4_ = fVar215 * fVar215;
    auVar189._20_4_ = fVar273 * fVar273;
    auVar189._24_4_ = fVar274 * fVar274;
    auVar189._28_4_ = 0;
    auVar202 = vfmadd231ps_fma(auVar189,local_580,local_580);
    auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),local_560,local_560);
    auVar103 = vrcpps_avx(ZEXT1632(auVar202));
    auVar158 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT1632(auVar158),ZEXT1632(auVar158));
    auVar290._8_4_ = 0x3f800000;
    auVar290._0_8_ = &DAT_3f8000003f800000;
    auVar290._12_4_ = 0x3f800000;
    auVar290._16_4_ = 0x3f800000;
    auVar290._20_4_ = 0x3f800000;
    auVar290._24_4_ = 0x3f800000;
    auVar290._28_4_ = 0x3f800000;
    auVar97 = vfnmadd213ps_fma(auVar103,ZEXT1632(auVar202),auVar290);
    auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar103,auVar103);
    local_a20 = vpermps_avx2(_DAT_0205d4a0,local_720);
    local_8e0 = vpermps_avx2(_DAT_0205d4a0,local_9a0);
    auVar291._4_4_ = fVar212 * local_a20._4_4_;
    auVar291._0_4_ = fVar211 * local_a20._0_4_;
    auVar291._8_4_ = fVar213 * local_a20._8_4_;
    auVar291._12_4_ = fVar214 * local_a20._12_4_;
    auVar291._16_4_ = fVar215 * local_a20._16_4_;
    auVar291._20_4_ = fVar273 * local_a20._20_4_;
    auVar291._24_4_ = fVar274 * local_a20._24_4_;
    auVar291._28_4_ = auVar103._28_4_;
    auVar99 = vfmsub231ps_fma(auVar291,local_8e0,local_560);
    auVar13 = vpermps_avx2(_DAT_0205d4a0,local_a00);
    auVar6._4_4_ = fVar170 * auVar13._4_4_;
    auVar6._0_4_ = fVar245 * auVar13._0_4_;
    auVar6._8_4_ = fVar171 * auVar13._8_4_;
    auVar6._12_4_ = fVar172 * auVar13._12_4_;
    auVar6._16_4_ = fVar231 * auVar13._16_4_;
    auVar6._20_4_ = fVar232 * auVar13._20_4_;
    auVar6._24_4_ = fVar233 * auVar13._24_4_;
    auVar6._28_4_ = auVar8._28_4_;
    auVar284 = vfmsub231ps_fma(auVar6,local_a20,local_580);
    auVar99 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar284._12_4_ * auVar284._12_4_,
                                                 CONCAT48(auVar284._8_4_ * auVar284._8_4_,
                                                          CONCAT44(auVar284._4_4_ * auVar284._4_4_,
                                                                   auVar284._0_4_ * auVar284._0_4_))
                                                )),ZEXT1632(auVar99),ZEXT1632(auVar99));
    fVar234 = local_8e0._0_4_;
    auVar224._0_4_ = fVar198 * fVar234;
    fVar242 = local_8e0._4_4_;
    auVar224._4_4_ = fVar210 * fVar242;
    fVar243 = local_8e0._8_4_;
    auVar224._8_4_ = fVar278 * fVar243;
    fVar244 = local_8e0._12_4_;
    auVar224._12_4_ = fVar279 * fVar244;
    fVar246 = local_8e0._16_4_;
    auVar224._16_4_ = fVar280 * fVar246;
    fVar247 = local_8e0._20_4_;
    auVar224._20_4_ = fVar281 * fVar247;
    fVar296 = local_8e0._24_4_;
    auVar224._24_4_ = fVar282 * fVar296;
    auVar224._28_4_ = 0;
    auVar284 = vfmsub231ps_fma(auVar224,auVar13,local_540);
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),ZEXT1632(auVar284),ZEXT1632(auVar284));
    auVar103 = vmaxps_avx(ZEXT1632(CONCAT412(auVar158._12_4_ * auVar97._12_4_,
                                             CONCAT48(auVar158._8_4_ * auVar97._8_4_,
                                                      CONCAT44(auVar158._4_4_ * auVar97._4_4_,
                                                               auVar158._0_4_ * auVar97._0_4_)))),
                          ZEXT1632(CONCAT412(auVar99._12_4_ * auVar97._12_4_,
                                             CONCAT48(auVar99._8_4_ * auVar97._8_4_,
                                                      CONCAT44(auVar99._4_4_ * auVar97._4_4_,
                                                               auVar99._0_4_ * auVar97._0_4_)))));
    local_760._0_4_ = auVar118._0_4_ + fVar115;
    local_760._4_4_ = auVar118._4_4_ + fVar151;
    local_760._8_4_ = auVar118._8_4_ + fVar152;
    local_760._12_4_ = auVar118._12_4_ + fVar153;
    local_760._16_4_ = fVar154 + 0.0;
    local_760._20_4_ = fVar155 + 0.0;
    local_760._24_4_ = fVar156 + 0.0;
    local_760._28_4_ = auVar111._28_4_ + 0.0;
    local_740 = ZEXT1632(auVar118);
    auVar111 = vsubps_avx(local_740,auVar14);
    local_780 = vpermps_avx2(_DAT_0205d4a0,auVar111);
    auVar14 = vpermps_avx2(_DAT_0205d4a0,local_740);
    auVar111 = vmaxps_avx(local_740,local_760);
    auVar8 = vmaxps_avx(local_780,auVar14);
    auVar9 = vrsqrtps_avx(ZEXT1632(auVar202));
    auVar111 = vmaxps_avx(auVar111,auVar8);
    fVar115 = auVar9._0_4_;
    fVar151 = auVar9._4_4_;
    fVar156 = auVar9._8_4_;
    fVar152 = auVar9._12_4_;
    fVar153 = auVar9._16_4_;
    fVar154 = auVar9._20_4_;
    fVar155 = auVar9._24_4_;
    auVar7._4_4_ = fVar151 * fVar151 * fVar151 * auVar202._4_4_ * -0.5;
    auVar7._0_4_ = fVar115 * fVar115 * fVar115 * auVar202._0_4_ * -0.5;
    auVar7._8_4_ = fVar156 * fVar156 * fVar156 * auVar202._8_4_ * -0.5;
    auVar7._12_4_ = fVar152 * fVar152 * fVar152 * auVar202._12_4_ * -0.5;
    auVar7._16_4_ = fVar153 * fVar153 * fVar153 * -0.0;
    auVar7._20_4_ = fVar154 * fVar154 * fVar154 * -0.0;
    auVar7._24_4_ = fVar155 * fVar155 * fVar155 * -0.0;
    auVar7._28_4_ = auVar14._28_4_;
    auVar140._8_4_ = 0x3fc00000;
    auVar140._0_8_ = 0x3fc000003fc00000;
    auVar140._12_4_ = 0x3fc00000;
    auVar140._16_4_ = 0x3fc00000;
    auVar140._20_4_ = 0x3fc00000;
    auVar140._24_4_ = 0x3fc00000;
    auVar140._28_4_ = 0x3fc00000;
    auVar97 = vfmadd231ps_fma(auVar7,auVar140,auVar9);
    fVar151 = auVar97._0_4_;
    fVar156 = auVar97._4_4_;
    auVar16._4_4_ = fVar210 * fVar156;
    auVar16._0_4_ = fVar198 * fVar151;
    fVar153 = auVar97._8_4_;
    auVar16._8_4_ = fVar278 * fVar153;
    fVar155 = auVar97._12_4_;
    auVar16._12_4_ = fVar279 * fVar155;
    auVar16._16_4_ = fVar280 * 0.0;
    auVar16._20_4_ = fVar281 * 0.0;
    auVar16._24_4_ = fVar282 * 0.0;
    auVar16._28_4_ = 0;
    auVar17._4_4_ = (float)local_840._4_4_ * fVar212 * fVar156;
    auVar17._0_4_ = (float)local_840._0_4_ * fVar211 * fVar151;
    auVar17._8_4_ = fStack_838 * fVar213 * fVar153;
    auVar17._12_4_ = fStack_834 * fVar214 * fVar155;
    auVar17._16_4_ = fStack_830 * fVar215 * 0.0;
    auVar17._20_4_ = fStack_82c * fVar273 * 0.0;
    auVar17._24_4_ = fStack_828 * fVar274 * 0.0;
    auVar17._28_4_ = local_540._28_4_;
    auVar97 = vfmadd231ps_fma(auVar17,auVar16,_local_800);
    _local_640 = ZEXT1632(auVar91);
    auVar165 = vsubps_avx(ZEXT832(0) << 0x20,_local_640);
    fVar198 = auVar165._0_4_;
    fVar210 = auVar165._4_4_;
    auVar18._4_4_ = fVar210 * fVar212 * fVar156;
    auVar18._0_4_ = fVar198 * fVar211 * fVar151;
    fVar211 = auVar165._8_4_;
    auVar18._8_4_ = fVar211 * fVar213 * fVar153;
    fVar212 = auVar165._12_4_;
    auVar18._12_4_ = fVar212 * fVar214 * fVar155;
    fVar213 = auVar165._16_4_;
    auVar18._16_4_ = fVar213 * fVar215 * 0.0;
    fVar214 = auVar165._20_4_;
    auVar18._20_4_ = fVar214 * fVar273 * 0.0;
    fVar215 = auVar165._24_4_;
    auVar18._24_4_ = fVar215 * fVar274 * 0.0;
    auVar18._28_4_ = local_8e0._28_4_;
    local_520 = ZEXT1632(auVar117);
    auVar163 = vsubps_avx(ZEXT832(0) << 0x20,local_520);
    auVar202 = vfmadd231ps_fma(auVar18,auVar163,auVar16);
    auVar19._4_4_ = fVar170 * fVar156;
    auVar19._0_4_ = fVar245 * fVar151;
    auVar19._8_4_ = fVar171 * fVar153;
    auVar19._12_4_ = fVar172 * fVar155;
    auVar19._16_4_ = fVar231 * 0.0;
    auVar19._20_4_ = fVar232 * 0.0;
    auVar19._24_4_ = fVar233 * 0.0;
    auVar19._28_4_ = auVar9._28_4_;
    auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar19,_local_7e0);
    auVar272 = ZEXT1664(auVar97);
    auVar291 = ZEXT832(0) << 0x20;
    auVar193 = vsubps_avx(auVar291,auVar188);
    auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar193,auVar19);
    auVar20._4_4_ = (float)local_840._4_4_ * fVar210;
    auVar20._0_4_ = (float)local_840._0_4_ * fVar198;
    auVar20._8_4_ = fStack_838 * fVar211;
    auVar20._12_4_ = fStack_834 * fVar212;
    auVar20._16_4_ = fStack_830 * fVar213;
    auVar20._20_4_ = fStack_82c * fVar214;
    auVar20._24_4_ = fStack_828 * fVar215;
    auVar20._28_4_ = auVar9._28_4_;
    auVar158 = vfmadd231ps_fma(auVar20,_local_800,auVar163);
    auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),_local_7e0,auVar193);
    fVar115 = auVar202._0_4_;
    fVar231 = auVar97._0_4_;
    fVar152 = auVar202._4_4_;
    fVar232 = auVar97._4_4_;
    fVar154 = auVar202._8_4_;
    fVar233 = auVar97._8_4_;
    fVar245 = auVar202._12_4_;
    fVar273 = auVar97._12_4_;
    auVar21._28_4_ = local_7e0._28_4_;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(fVar273 * fVar245,
                            CONCAT48(fVar233 * fVar154,CONCAT44(fVar232 * fVar152,fVar231 * fVar115)
                                    )));
    auVar10 = vsubps_avx(ZEXT1632(auVar158),auVar21);
    auVar22._4_4_ = fVar210 * fVar210;
    auVar22._0_4_ = fVar198 * fVar198;
    auVar22._8_4_ = fVar211 * fVar211;
    auVar22._12_4_ = fVar212 * fVar212;
    auVar22._16_4_ = fVar213 * fVar213;
    auVar22._20_4_ = fVar214 * fVar214;
    auVar22._24_4_ = fVar215 * fVar215;
    auVar22._28_4_ = local_7e0._28_4_;
    auVar158 = vfmadd231ps_fma(auVar22,auVar163,auVar163);
    auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar193,auVar193);
    auVar8._28_4_ = uStack_824;
    auVar8._0_28_ =
         ZEXT1628(CONCAT412(fVar245 * fVar245,
                            CONCAT48(fVar154 * fVar154,CONCAT44(fVar152 * fVar152,fVar115 * fVar115)
                                    )));
    local_600 = vsubps_avx(ZEXT1632(auVar158),auVar8);
    auVar9 = vsqrtps_avx(auVar103);
    fVar115 = (auVar9._0_4_ + auVar111._0_4_) * 1.0000002;
    fVar152 = (auVar9._4_4_ + auVar111._4_4_) * 1.0000002;
    fVar154 = (auVar9._8_4_ + auVar111._8_4_) * 1.0000002;
    fVar245 = (auVar9._12_4_ + auVar111._12_4_) * 1.0000002;
    fVar170 = (auVar9._16_4_ + auVar111._16_4_) * 1.0000002;
    fVar171 = (auVar9._20_4_ + auVar111._20_4_) * 1.0000002;
    fVar172 = (auVar9._24_4_ + auVar111._24_4_) * 1.0000002;
    auVar23._4_4_ = fVar152 * fVar152;
    auVar23._0_4_ = fVar115 * fVar115;
    auVar23._8_4_ = fVar154 * fVar154;
    auVar23._12_4_ = fVar245 * fVar245;
    auVar23._16_4_ = fVar170 * fVar170;
    auVar23._20_4_ = fVar171 * fVar171;
    auVar23._24_4_ = fVar172 * fVar172;
    auVar23._28_4_ = auVar9._28_4_ + auVar111._28_4_;
    fVar152 = auVar10._0_4_ + auVar10._0_4_;
    fVar154 = auVar10._4_4_ + auVar10._4_4_;
    local_3a0._0_8_ = CONCAT44(fVar154,fVar152);
    local_3a0._8_4_ = auVar10._8_4_ + auVar10._8_4_;
    local_3a0._12_4_ = auVar10._12_4_ + auVar10._12_4_;
    local_3a0._16_4_ = auVar10._16_4_ + auVar10._16_4_;
    local_3a0._20_4_ = auVar10._20_4_ + auVar10._20_4_;
    local_3a0._24_4_ = auVar10._24_4_ + auVar10._24_4_;
    local_3a0._28_4_ = auVar10._28_4_ + auVar10._28_4_;
    auVar111 = vsubps_avx(local_600,auVar23);
    auVar271 = ZEXT1632(auVar97);
    local_5a0 = ZEXT1632(CONCAT412(fVar273 * fVar273,
                                   CONCAT48(fVar233 * fVar233,
                                            CONCAT44(fVar232 * fVar232,fVar231 * fVar231))));
    auVar263 = ZEXT3264(local_5a0);
    auVar10 = vsubps_avx(local_2e0,local_5a0);
    auVar24._4_4_ = fVar154 * fVar154;
    auVar24._0_4_ = fVar152 * fVar152;
    auVar24._8_4_ = local_3a0._8_4_ * local_3a0._8_4_;
    auVar24._12_4_ = local_3a0._12_4_ * local_3a0._12_4_;
    auVar24._16_4_ = local_3a0._16_4_ * local_3a0._16_4_;
    auVar24._20_4_ = local_3a0._20_4_ * local_3a0._20_4_;
    auVar24._24_4_ = local_3a0._24_4_ * local_3a0._24_4_;
    auVar24._28_4_ = 0x3f800002;
    fVar245 = auVar10._0_4_;
    local_620._0_4_ = fVar245 * 4.0;
    fVar170 = auVar10._4_4_;
    local_620._4_4_ = fVar170 * 4.0;
    fVar171 = auVar10._8_4_;
    fStack_618 = fVar171 * 4.0;
    fVar172 = auVar10._12_4_;
    fStack_614 = fVar172 * 4.0;
    fVar231 = auVar10._16_4_;
    fStack_610 = fVar231 * 4.0;
    fVar232 = auVar10._20_4_;
    fStack_60c = fVar232 * 4.0;
    fVar233 = auVar10._24_4_;
    fStack_608 = fVar233 * 4.0;
    uStack_604 = 0x40800000;
    auVar25._4_4_ = auVar111._4_4_ * (float)local_620._4_4_;
    auVar25._0_4_ = auVar111._0_4_ * (float)local_620._0_4_;
    auVar25._8_4_ = auVar111._8_4_ * fStack_618;
    auVar25._12_4_ = auVar111._12_4_ * fStack_614;
    auVar25._16_4_ = auVar111._16_4_ * fStack_610;
    auVar25._20_4_ = auVar111._20_4_ * fStack_60c;
    auVar25._24_4_ = auVar111._24_4_ * fStack_608;
    auVar25._28_4_ = 0x40800000;
    auVar191 = vsubps_avx(auVar24,auVar25);
    auVar103 = vcmpps_avx(auVar191,auVar291,5);
    auVar285 = ZEXT1632(auVar202);
    fVar115 = auVar10._28_4_;
    if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar103 >> 0x7f,0) == '\0') &&
          (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar103 >> 0xbf,0) == '\0') &&
        (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar103[0x1f])
    {
      local_a60._8_4_ = 0x7f800000;
      local_a60._0_8_ = 0x7f8000007f800000;
      local_a60._12_4_ = 0x7f800000;
      local_a60._16_4_ = 0x7f800000;
      local_a60._20_4_ = 0x7f800000;
      local_a60._24_4_ = 0x7f800000;
      local_a60._28_4_ = 0x7f800000;
      auVar225._8_4_ = 0xff800000;
      auVar225._0_8_ = 0xff800000ff800000;
      auVar225._12_4_ = 0xff800000;
      auVar225._16_4_ = 0xff800000;
      auVar225._20_4_ = 0xff800000;
      auVar225._24_4_ = 0xff800000;
      auVar225._28_4_ = 0xff800000;
      auVar252 = local_600;
      auVar267 = local_560;
    }
    else {
      auVar7 = vsqrtps_avx(auVar191);
      auVar251._0_4_ = fVar245 + fVar245;
      auVar251._4_4_ = fVar170 + fVar170;
      auVar251._8_4_ = fVar171 + fVar171;
      auVar251._12_4_ = fVar172 + fVar172;
      auVar251._16_4_ = fVar231 + fVar231;
      auVar251._20_4_ = fVar232 + fVar232;
      auVar251._24_4_ = fVar233 + fVar233;
      auVar251._28_4_ = fVar115 + fVar115;
      auVar6 = vrcpps_avx(auVar251);
      auVar8 = vcmpps_avx(auVar191,auVar291,5);
      auVar226._8_4_ = 0x3f800000;
      auVar226._0_8_ = &DAT_3f8000003f800000;
      auVar226._12_4_ = 0x3f800000;
      auVar226._16_4_ = 0x3f800000;
      auVar226._20_4_ = 0x3f800000;
      auVar226._24_4_ = 0x3f800000;
      auVar226._28_4_ = 0x3f800000;
      auVar97 = vfnmadd213ps_fma(auVar251,auVar6,auVar226);
      auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar6,auVar6);
      auVar104._0_8_ = CONCAT44(fVar154,fVar152) ^ 0x8000000080000000;
      auVar104._8_4_ = -local_3a0._8_4_;
      auVar104._12_4_ = -local_3a0._12_4_;
      auVar104._16_4_ = -local_3a0._16_4_;
      auVar104._20_4_ = -local_3a0._20_4_;
      auVar104._24_4_ = -local_3a0._24_4_;
      auVar104._28_4_ = -local_3a0._28_4_;
      auVar191 = vsubps_avx(auVar104,auVar7);
      auVar26._4_4_ = auVar191._4_4_ * auVar97._4_4_;
      auVar26._0_4_ = auVar191._0_4_ * auVar97._0_4_;
      auVar26._8_4_ = auVar191._8_4_ * auVar97._8_4_;
      auVar26._12_4_ = auVar191._12_4_ * auVar97._12_4_;
      auVar26._16_4_ = auVar191._16_4_ * 0.0;
      auVar26._20_4_ = auVar191._20_4_ * 0.0;
      auVar26._24_4_ = auVar191._24_4_ * 0.0;
      auVar26._28_4_ = auVar191._28_4_;
      auVar191 = vsubps_avx(auVar7,local_3a0);
      auVar27._4_4_ = auVar191._4_4_ * auVar97._4_4_;
      auVar27._0_4_ = auVar191._0_4_ * auVar97._0_4_;
      auVar27._8_4_ = auVar191._8_4_ * auVar97._8_4_;
      auVar27._12_4_ = auVar191._12_4_ * auVar97._12_4_;
      auVar27._16_4_ = auVar191._16_4_ * 0.0;
      auVar27._20_4_ = auVar191._20_4_ * 0.0;
      auVar27._24_4_ = auVar191._24_4_ * 0.0;
      auVar27._28_4_ = auVar191._28_4_;
      auVar97 = vfmadd213ps_fma(auVar271,auVar26,auVar285);
      local_4e0 = ZEXT1632(CONCAT412(fVar155 * auVar97._12_4_,
                                     CONCAT48(fVar153 * auVar97._8_4_,
                                              CONCAT44(fVar156 * auVar97._4_4_,
                                                       fVar151 * auVar97._0_4_))));
      auVar97 = vfmadd213ps_fma(auVar271,auVar27,auVar285);
      local_500 = ZEXT1632(CONCAT412(fVar155 * auVar97._12_4_,
                                     CONCAT48(fVar153 * auVar97._8_4_,
                                              CONCAT44(fVar156 * auVar97._4_4_,
                                                       fVar151 * auVar97._0_4_))));
      auVar239._8_4_ = 0x7f800000;
      auVar239._0_8_ = 0x7f8000007f800000;
      auVar239._12_4_ = 0x7f800000;
      auVar239._16_4_ = 0x7f800000;
      auVar239._20_4_ = 0x7f800000;
      auVar239._24_4_ = 0x7f800000;
      auVar239._28_4_ = 0x7f800000;
      local_a60 = vblendvps_avx(auVar239,auVar26,auVar8);
      auVar62._4_4_ = uStack_85c;
      auVar62._0_4_ = local_860;
      auVar62._8_4_ = uStack_858;
      auVar62._12_4_ = uStack_854;
      auVar62._16_4_ = uStack_850;
      auVar62._20_4_ = uStack_84c;
      auVar62._24_4_ = uStack_848;
      auVar62._28_4_ = uStack_844;
      auVar191 = vandps_avx(local_5a0,auVar62);
      auVar191 = vmaxps_avx(local_4a0,auVar191);
      auVar252._8_4_ = 0x36000000;
      auVar252._0_8_ = 0x3600000036000000;
      auVar252._12_4_ = 0x36000000;
      auVar252._16_4_ = 0x36000000;
      auVar252._20_4_ = 0x36000000;
      auVar252._24_4_ = 0x36000000;
      auVar252._28_4_ = 0x36000000;
      auVar28._4_4_ = auVar191._4_4_ * 1.9073486e-06;
      auVar28._0_4_ = auVar191._0_4_ * 1.9073486e-06;
      auVar28._8_4_ = auVar191._8_4_ * 1.9073486e-06;
      auVar28._12_4_ = auVar191._12_4_ * 1.9073486e-06;
      auVar28._16_4_ = auVar191._16_4_ * 1.9073486e-06;
      auVar28._20_4_ = auVar191._20_4_ * 1.9073486e-06;
      auVar28._24_4_ = auVar191._24_4_ * 1.9073486e-06;
      auVar28._28_4_ = auVar191._28_4_;
      auVar191 = vandps_avx(auVar10,auVar62);
      auVar191 = vcmpps_avx(auVar191,auVar28,1);
      auVar105._8_4_ = 0xff800000;
      auVar105._0_8_ = 0xff800000ff800000;
      auVar105._12_4_ = 0xff800000;
      auVar105._16_4_ = 0xff800000;
      auVar105._20_4_ = 0xff800000;
      auVar105._24_4_ = 0xff800000;
      auVar105._28_4_ = 0xff800000;
      auVar225 = vblendvps_avx(auVar105,auVar27,auVar8);
      auVar291 = auVar8 & auVar191;
      auVar267 = auVar10;
      if ((((((((auVar291 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar291 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar291 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar291 >> 0x7f,0) != '\0') ||
            (auVar291 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar291 >> 0xbf,0) != '\0') ||
          (auVar291 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar291[0x1f] < '\0') {
        auVar103 = vandps_avx(auVar8,auVar191);
        auVar191 = vcmpps_avx(auVar111,_DAT_02020f00,2);
        auVar267._8_4_ = 0xff800000;
        auVar267._0_8_ = 0xff800000ff800000;
        auVar267._12_4_ = 0xff800000;
        auVar267._16_4_ = 0xff800000;
        auVar267._20_4_ = 0xff800000;
        auVar267._24_4_ = 0xff800000;
        auVar267._28_4_ = 0xff800000;
        auVar295._8_4_ = 0x7f800000;
        auVar295._0_8_ = 0x7f8000007f800000;
        auVar295._12_4_ = 0x7f800000;
        auVar295._16_4_ = 0x7f800000;
        auVar295._20_4_ = 0x7f800000;
        auVar295._24_4_ = 0x7f800000;
        auVar295._28_4_ = 0x7f800000;
        auVar111 = vblendvps_avx(auVar295,auVar267,auVar191);
        auVar97 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
        auVar291 = vpmovsxwd_avx2(auVar97);
        local_a60 = vblendvps_avx(local_a60,auVar111,auVar291);
        auVar252 = vblendvps_avx(auVar267,auVar295,auVar191);
        auVar225 = vblendvps_avx(auVar225,auVar252,auVar291);
        auVar113._0_8_ = auVar103._0_8_ ^ 0xffffffffffffffff;
        auVar113._8_4_ = auVar103._8_4_ ^ 0xffffffff;
        auVar113._12_4_ = auVar103._12_4_ ^ 0xffffffff;
        auVar113._16_4_ = auVar103._16_4_ ^ 0xffffffff;
        auVar113._20_4_ = auVar103._20_4_ ^ 0xffffffff;
        auVar113._24_4_ = auVar103._24_4_ ^ 0xffffffff;
        auVar113._28_4_ = auVar103._28_4_ ^ 0xffffffff;
        auVar103 = vorps_avx(auVar191,auVar113);
        auVar103 = vandps_avx(auVar8,auVar103);
      }
    }
    auVar238._8_4_ = 0x3f800000;
    auVar238._0_8_ = &DAT_3f8000003f800000;
    auVar238._12_4_ = 0x3f800000;
    auVar238._16_4_ = 0x3f800000;
    auVar238._20_4_ = 0x3f800000;
    auVar238._24_4_ = 0x3f800000;
    auVar238._28_4_ = 0x3f800000;
    auVar268 = ZEXT3264(auVar267);
    auVar255 = ZEXT3264(auVar252);
    auVar230 = ZEXT3264(auVar225);
    auVar276 = ZEXT3264(auVar8);
    auVar111 = local_480 & auVar103;
    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar111 >> 0x7f,0) != '\0') ||
          (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar111 >> 0xbf,0) != '\0') ||
        (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar111[0x1f] < '\0') {
      fVar152 = *(float *)(ray + k * 4 + 0x80) - (float)local_8b0._0_4_;
      auVar106._4_4_ = fVar152;
      auVar106._0_4_ = fVar152;
      auVar106._8_4_ = fVar152;
      auVar106._12_4_ = fVar152;
      auVar106._16_4_ = fVar152;
      auVar106._20_4_ = fVar152;
      auVar106._24_4_ = fVar152;
      auVar106._28_4_ = fVar152;
      auVar191 = vminps_avx(auVar106,auVar225);
      auVar29._4_4_ = fVar210 * local_9a0._4_4_;
      auVar29._0_4_ = fVar198 * (float)local_9a0._0_4_;
      auVar29._8_4_ = fVar211 * local_9a0._8_4_;
      auVar29._12_4_ = fVar212 * local_9a0._12_4_;
      auVar29._16_4_ = fVar213 * local_9a0._16_4_;
      auVar29._20_4_ = fVar214 * local_9a0._20_4_;
      auVar29._24_4_ = fVar215 * local_9a0._24_4_;
      auVar29._28_4_ = auVar165._28_4_;
      auVar97 = vfmadd213ps_fma(auVar163,local_a00,auVar29);
      auVar202 = vfmadd213ps_fma(auVar193,local_720,ZEXT1632(auVar97));
      auVar49._4_4_ = local_9a0._4_4_ * (float)local_840._4_4_;
      auVar49._0_4_ = (float)local_9a0._0_4_ * (float)local_840._0_4_;
      auVar49._8_4_ = local_9a0._8_4_ * fStack_838;
      auVar49._12_4_ = local_9a0._12_4_ * fStack_834;
      auVar49._16_4_ = local_9a0._16_4_ * fStack_830;
      auVar49._20_4_ = local_9a0._20_4_ * fStack_82c;
      auVar49._24_4_ = local_9a0._24_4_ * fStack_828;
      auVar49._28_4_ = auVar225._28_4_;
      auVar97 = vfmadd231ps_fma(auVar49,_local_800,local_a00);
      auVar158 = vfmadd231ps_fma(ZEXT1632(auVar97),_local_7e0,local_720);
      auVar63._4_4_ = uStack_85c;
      auVar63._0_4_ = local_860;
      auVar63._8_4_ = uStack_858;
      auVar63._12_4_ = uStack_854;
      auVar63._16_4_ = uStack_850;
      auVar63._20_4_ = uStack_84c;
      auVar63._24_4_ = uStack_848;
      auVar63._28_4_ = uStack_844;
      auVar111 = vandps_avx(auVar63,ZEXT1632(auVar158));
      auVar207._8_4_ = 0x219392ef;
      auVar207._0_8_ = 0x219392ef219392ef;
      auVar207._12_4_ = 0x219392ef;
      auVar207._16_4_ = 0x219392ef;
      auVar207._20_4_ = 0x219392ef;
      auVar207._24_4_ = 0x219392ef;
      auVar207._28_4_ = 0x219392ef;
      auVar8 = vcmpps_avx(auVar111,auVar207,1);
      auVar111 = vrcpps_avx(ZEXT1632(auVar158));
      auVar163 = ZEXT1632(auVar158);
      auVar97 = vfnmadd213ps_fma(auVar111,auVar163,auVar238);
      auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar111,auVar111);
      auVar190._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
      auVar190._8_4_ = auVar158._8_4_ ^ 0x80000000;
      auVar190._12_4_ = auVar158._12_4_ ^ 0x80000000;
      auVar190._16_4_ = 0x80000000;
      auVar190._20_4_ = 0x80000000;
      auVar190._24_4_ = 0x80000000;
      auVar190._28_4_ = 0x80000000;
      auVar253._0_4_ = auVar97._0_4_ * -auVar202._0_4_;
      auVar253._4_4_ = auVar97._4_4_ * -auVar202._4_4_;
      auVar253._8_4_ = auVar97._8_4_ * -auVar202._8_4_;
      auVar253._12_4_ = auVar97._12_4_ * -auVar202._12_4_;
      auVar253._16_4_ = 0x80000000;
      auVar253._20_4_ = 0x80000000;
      auVar253._24_4_ = 0x80000000;
      auVar253._28_4_ = 0;
      auVar111 = vcmpps_avx(auVar163,auVar190,1);
      auVar111 = vorps_avx(auVar8,auVar111);
      auVar292._8_4_ = 0xff800000;
      auVar292._0_8_ = 0xff800000ff800000;
      auVar292._12_4_ = 0xff800000;
      auVar292._16_4_ = 0xff800000;
      auVar292._20_4_ = 0xff800000;
      auVar292._24_4_ = 0xff800000;
      auVar292._28_4_ = 0xff800000;
      auVar111 = vblendvps_avx(auVar253,auVar292,auVar111);
      auVar67._4_4_ = fStack_37c;
      auVar67._0_4_ = local_380;
      auVar67._8_4_ = fStack_378;
      auVar67._12_4_ = fStack_374;
      auVar67._16_4_ = fStack_370;
      auVar67._20_4_ = fStack_36c;
      auVar67._24_4_ = fStack_368;
      auVar67._28_4_ = fStack_364;
      auVar165 = vmaxps_avx(auVar67,local_a60);
      auVar165 = vmaxps_avx(auVar165,auVar111);
      auVar111 = vcmpps_avx(auVar163,auVar190,6);
      auVar111 = vorps_avx(auVar8,auVar111);
      auVar293._8_4_ = 0x7f800000;
      auVar293._0_8_ = 0x7f8000007f800000;
      auVar293._12_4_ = 0x7f800000;
      auVar293._16_4_ = 0x7f800000;
      auVar293._20_4_ = 0x7f800000;
      auVar293._24_4_ = 0x7f800000;
      auVar293._28_4_ = 0x7f800000;
      auVar111 = vblendvps_avx(auVar253,auVar293,auVar111);
      auVar163 = vminps_avx(auVar191,auVar111);
      auVar111 = vsubps_avx(ZEXT832(0) << 0x20,auVar12);
      auVar8 = vsubps_avx(ZEXT832(0) << 0x20,local_9e0);
      auVar30._4_4_ = auVar8._4_4_ * fVar242;
      auVar30._0_4_ = auVar8._0_4_ * fVar234;
      auVar30._8_4_ = auVar8._8_4_ * fVar243;
      auVar30._12_4_ = auVar8._12_4_ * fVar244;
      auVar30._16_4_ = auVar8._16_4_ * fVar246;
      auVar30._20_4_ = auVar8._20_4_ * fVar247;
      auVar30._24_4_ = auVar8._24_4_ * fVar296;
      auVar30._28_4_ = auVar8._28_4_;
      auVar97 = vfnmsub231ps_fma(auVar30,auVar13,auVar111);
      auVar111 = vsubps_avx(ZEXT832(0) << 0x20,_local_b00);
      auVar202 = vfnmadd231ps_fma(ZEXT1632(auVar97),local_a20,auVar111);
      auVar31._4_4_ = fVar242 * (float)local_840._4_4_;
      auVar31._0_4_ = fVar234 * (float)local_840._0_4_;
      auVar31._8_4_ = fVar243 * fStack_838;
      auVar31._12_4_ = fVar244 * fStack_834;
      auVar31._16_4_ = fVar246 * fStack_830;
      auVar31._20_4_ = fVar247 * fStack_82c;
      auVar31._24_4_ = fVar296 * fStack_828;
      auVar31._28_4_ = auVar111._28_4_;
      auVar97 = vfnmsub231ps_fma(auVar31,_local_800,auVar13);
      auVar158 = vfnmadd231ps_fma(ZEXT1632(auVar97),_local_7e0,local_a20);
      auVar111 = vandps_avx(auVar63,ZEXT1632(auVar158));
      auVar193 = vrcpps_avx(ZEXT1632(auVar158));
      auVar107._8_4_ = 0x219392ef;
      auVar107._0_8_ = 0x219392ef219392ef;
      auVar107._12_4_ = 0x219392ef;
      auVar107._16_4_ = 0x219392ef;
      auVar107._20_4_ = 0x219392ef;
      auVar107._24_4_ = 0x219392ef;
      auVar107._28_4_ = 0x219392ef;
      auVar8 = vcmpps_avx(auVar111,auVar107,1);
      auVar191 = ZEXT1632(auVar158);
      auVar97 = vfnmadd213ps_fma(auVar193,auVar191,auVar238);
      auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar193,auVar193);
      auVar254._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
      auVar254._8_4_ = auVar158._8_4_ ^ 0x80000000;
      auVar254._12_4_ = auVar158._12_4_ ^ 0x80000000;
      auVar254._16_4_ = 0x80000000;
      auVar254._20_4_ = 0x80000000;
      auVar254._24_4_ = 0x80000000;
      auVar254._28_4_ = 0x80000000;
      auVar255 = ZEXT3264(auVar254);
      auVar32._4_4_ = auVar97._4_4_ * -auVar202._4_4_;
      auVar32._0_4_ = auVar97._0_4_ * -auVar202._0_4_;
      auVar32._8_4_ = auVar97._8_4_ * -auVar202._8_4_;
      auVar32._12_4_ = auVar97._12_4_ * -auVar202._12_4_;
      auVar32._16_4_ = 0x80000000;
      auVar32._20_4_ = 0x80000000;
      auVar32._24_4_ = 0x80000000;
      auVar32._28_4_ = 0x80000000;
      auVar230 = ZEXT3264(auVar32);
      auVar111 = vcmpps_avx(auVar191,auVar254,1);
      auVar111 = vorps_avx(auVar111,auVar8);
      auVar261._8_4_ = 0xff800000;
      auVar261._0_8_ = 0xff800000ff800000;
      auVar261._12_4_ = 0xff800000;
      auVar261._16_4_ = 0xff800000;
      auVar261._20_4_ = 0xff800000;
      auVar261._24_4_ = 0xff800000;
      auVar261._28_4_ = 0xff800000;
      auVar111 = vblendvps_avx(auVar32,auVar261,auVar111);
      auVar276 = ZEXT3264(auVar111);
      local_a40 = vmaxps_avx(auVar165,auVar111);
      auVar263 = ZEXT3264(local_a40);
      auVar111 = vcmpps_avx(auVar191,auVar254,6);
      auVar111 = vorps_avx(auVar8,auVar111);
      auVar192._8_4_ = 0x7f800000;
      auVar192._0_8_ = 0x7f8000007f800000;
      auVar192._12_4_ = 0x7f800000;
      auVar192._16_4_ = 0x7f800000;
      auVar192._20_4_ = 0x7f800000;
      auVar192._24_4_ = 0x7f800000;
      auVar192._28_4_ = 0x7f800000;
      auVar111 = vblendvps_avx(auVar32,auVar192,auVar111);
      auVar103 = vandps_avx(auVar103,local_480);
      local_3c0 = vminps_avx(auVar163,auVar111);
      auVar268 = ZEXT3264(local_3c0);
      auVar111 = vcmpps_avx(local_a40,local_3c0,2);
      auVar8 = auVar103 & auVar111;
      if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0x7f,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar8 >> 0xbf,0) != '\0') ||
          (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar8[0x1f] < '\0')
      {
        auVar8 = vminps_avx(local_4e0,auVar238);
        auVar8 = vmaxps_avx(auVar8,ZEXT832(0) << 0x20);
        auVar165 = vminps_avx(local_500,auVar238);
        auVar165 = vmaxps_avx(auVar165,ZEXT832(0) << 0x20);
        auVar33._4_4_ = (auVar8._4_4_ + 1.0) * 0.125;
        auVar33._0_4_ = (auVar8._0_4_ + 0.0) * 0.125;
        auVar33._8_4_ = (auVar8._8_4_ + 2.0) * 0.125;
        auVar33._12_4_ = (auVar8._12_4_ + 3.0) * 0.125;
        auVar33._16_4_ = (auVar8._16_4_ + 4.0) * 0.125;
        auVar33._20_4_ = (auVar8._20_4_ + 5.0) * 0.125;
        auVar33._24_4_ = (auVar8._24_4_ + 6.0) * 0.125;
        auVar33._28_4_ = auVar8._28_4_ + 7.0;
        auVar97 = vfmadd213ps_fma(auVar33,local_920,local_900);
        auVar34._4_4_ = (auVar165._4_4_ + 1.0) * 0.125;
        auVar34._0_4_ = (auVar165._0_4_ + 0.0) * 0.125;
        auVar34._8_4_ = (auVar165._8_4_ + 2.0) * 0.125;
        auVar34._12_4_ = (auVar165._12_4_ + 3.0) * 0.125;
        auVar34._16_4_ = (auVar165._16_4_ + 4.0) * 0.125;
        auVar34._20_4_ = (auVar165._20_4_ + 5.0) * 0.125;
        auVar34._24_4_ = (auVar165._24_4_ + 6.0) * 0.125;
        auVar34._28_4_ = auVar165._28_4_ + 7.0;
        auVar202 = vfmadd213ps_fma(auVar34,local_920,local_900);
        auVar8 = vminps_avx(local_740,local_760);
        auVar165 = vminps_avx(local_780,auVar14);
        auVar8 = vminps_avx(auVar8,auVar165);
        auVar8 = vsubps_avx(auVar8,auVar9);
        auVar103 = vandps_avx(auVar111,auVar103);
        local_4e0 = ZEXT1632(auVar97);
        local_500 = ZEXT1632(auVar202);
        auVar35._4_4_ = auVar8._4_4_ * 0.99999976;
        auVar35._0_4_ = auVar8._0_4_ * 0.99999976;
        auVar35._8_4_ = auVar8._8_4_ * 0.99999976;
        auVar35._12_4_ = auVar8._12_4_ * 0.99999976;
        auVar35._16_4_ = auVar8._16_4_ * 0.99999976;
        auVar35._20_4_ = auVar8._20_4_ * 0.99999976;
        auVar35._24_4_ = auVar8._24_4_ * 0.99999976;
        auVar35._28_4_ = 0x3f7ffffc;
        auVar111 = vmaxps_avx(ZEXT832(0) << 0x20,auVar35);
        auVar36._4_4_ = auVar111._4_4_ * auVar111._4_4_;
        auVar36._0_4_ = auVar111._0_4_ * auVar111._0_4_;
        auVar36._8_4_ = auVar111._8_4_ * auVar111._8_4_;
        auVar36._12_4_ = auVar111._12_4_ * auVar111._12_4_;
        auVar36._16_4_ = auVar111._16_4_ * auVar111._16_4_;
        auVar36._20_4_ = auVar111._20_4_ * auVar111._20_4_;
        auVar36._24_4_ = auVar111._24_4_ * auVar111._24_4_;
        auVar36._28_4_ = auVar111._28_4_;
        auVar8 = vsubps_avx(local_600,auVar36);
        auVar276 = ZEXT3264(auVar8);
        auVar37._4_4_ = auVar8._4_4_ * (float)local_620._4_4_;
        auVar37._0_4_ = auVar8._0_4_ * (float)local_620._0_4_;
        auVar37._8_4_ = auVar8._8_4_ * fStack_618;
        auVar37._12_4_ = auVar8._12_4_ * fStack_614;
        auVar37._16_4_ = auVar8._16_4_ * fStack_610;
        auVar37._20_4_ = auVar8._20_4_ * fStack_60c;
        auVar37._24_4_ = auVar8._24_4_ * fStack_608;
        auVar37._28_4_ = auVar111._28_4_;
        auVar9 = vsubps_avx(auVar24,auVar37);
        local_880 = ZEXT432(0) << 0x20;
        local_980 = vcmpps_avx(auVar9,ZEXT832(0) << 0x20,5);
        auVar111 = local_980;
        if ((((((((local_980 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_980 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_980 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_980 >> 0x7f,0) == '\0') &&
              (local_980 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_980 >> 0xbf,0) == '\0') &&
            (local_980 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_980[0x1f]) {
          auVar163 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_620 = ZEXT832(0) << 0x20;
          _local_640 = ZEXT832(0) << 0x20;
          auVar193 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar206 = ZEXT828(0) << 0x20;
          auVar227._8_4_ = 0x7f800000;
          auVar227._0_8_ = 0x7f8000007f800000;
          auVar227._12_4_ = 0x7f800000;
          auVar227._16_4_ = 0x7f800000;
          auVar227._20_4_ = 0x7f800000;
          auVar227._24_4_ = 0x7f800000;
          auVar227._28_4_ = 0x7f800000;
          auVar240._8_4_ = 0xff800000;
          auVar240._0_8_ = 0xff800000ff800000;
          auVar240._12_4_ = 0xff800000;
          auVar240._16_4_ = 0xff800000;
          auVar240._20_4_ = 0xff800000;
          auVar240._24_4_ = 0xff800000;
          auVar240._28_4_ = 0xff800000;
          local_980 = auVar12;
        }
        else {
          auVar164._0_4_ = fVar245 + fVar245;
          auVar164._4_4_ = fVar170 + fVar170;
          auVar164._8_4_ = fVar171 + fVar171;
          auVar164._12_4_ = fVar172 + fVar172;
          auVar164._16_4_ = fVar231 + fVar231;
          auVar164._20_4_ = fVar232 + fVar232;
          auVar164._24_4_ = fVar233 + fVar233;
          auVar164._28_4_ = fVar115 + fVar115;
          auVar165 = vrcpps_avx(auVar164);
          auVar97 = vfnmadd213ps_fma(auVar164,auVar165,auVar238);
          auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar165,auVar165);
          auVar165 = vsqrtps_avx(auVar9);
          auVar208._0_8_ = local_3a0._0_8_ ^ 0x8000000080000000;
          auVar208._8_4_ = -local_3a0._8_4_;
          auVar208._12_4_ = -local_3a0._12_4_;
          auVar208._16_4_ = -local_3a0._16_4_;
          auVar208._20_4_ = -local_3a0._20_4_;
          auVar208._24_4_ = -local_3a0._24_4_;
          auVar208._28_4_ = -local_3a0._28_4_;
          auVar163 = vsubps_avx(auVar208,auVar165);
          auVar165 = vsubps_avx(auVar165,local_3a0);
          fVar245 = auVar163._0_4_ * auVar97._0_4_;
          fVar246 = auVar163._4_4_ * auVar97._4_4_;
          auVar38._4_4_ = fVar246;
          auVar38._0_4_ = fVar245;
          fVar247 = auVar163._8_4_ * auVar97._8_4_;
          auVar38._8_4_ = fVar247;
          fVar296 = auVar163._12_4_ * auVar97._12_4_;
          auVar38._12_4_ = fVar296;
          fVar170 = auVar163._16_4_ * 0.0;
          auVar38._16_4_ = fVar170;
          fVar171 = auVar163._20_4_ * 0.0;
          auVar38._20_4_ = fVar171;
          fVar172 = auVar163._24_4_ * 0.0;
          auVar38._24_4_ = fVar172;
          auVar38._28_4_ = fVar11;
          fVar115 = auVar165._0_4_ * auVar97._0_4_;
          fVar234 = auVar165._4_4_ * auVar97._4_4_;
          auVar39._4_4_ = fVar234;
          auVar39._0_4_ = fVar115;
          fVar242 = auVar165._8_4_ * auVar97._8_4_;
          auVar39._8_4_ = fVar242;
          fVar152 = auVar165._12_4_ * auVar97._12_4_;
          auVar39._12_4_ = fVar152;
          fVar243 = auVar165._16_4_ * 0.0;
          auVar39._16_4_ = fVar243;
          fVar154 = auVar165._20_4_ * 0.0;
          auVar39._20_4_ = fVar154;
          fVar244 = auVar165._24_4_ * 0.0;
          auVar39._24_4_ = fVar244;
          auVar39._28_4_ = local_980._28_4_;
          auVar97 = vfmadd213ps_fma(auVar271,auVar38,auVar285);
          auVar202 = vfmadd213ps_fma(auVar271,auVar39,auVar285);
          auVar40._28_4_ = auVar163._28_4_;
          auVar40._0_28_ =
               ZEXT1628(CONCAT412(fVar155 * auVar97._12_4_,
                                  CONCAT48(fVar153 * auVar97._8_4_,
                                           CONCAT44(fVar156 * auVar97._4_4_,fVar151 * auVar97._0_4_)
                                          )));
          auVar165 = ZEXT1632(CONCAT412(auVar202._12_4_ * fVar155,
                                        CONCAT48(auVar202._8_4_ * fVar153,
                                                 CONCAT44(auVar202._4_4_ * fVar156,
                                                          auVar202._0_4_ * fVar151))));
          auVar97 = vfmadd213ps_fma(local_560,auVar40,auVar188);
          auVar202 = vfmadd213ps_fma(local_560,auVar165,auVar188);
          auVar158 = vfmadd213ps_fma(local_580,auVar40,local_520);
          auVar99 = vfmadd213ps_fma(local_580,auVar165,local_520);
          auVar284 = vfmadd213ps_fma(auVar40,local_540,_local_640);
          auVar125 = vfmadd213ps_fma(local_540,auVar165,_local_640);
          auVar41._4_4_ = fVar246 * (float)local_7e0._4_4_;
          auVar41._0_4_ = fVar245 * (float)local_7e0._0_4_;
          auVar41._8_4_ = fVar247 * fStack_7d8;
          auVar41._12_4_ = fVar296 * fStack_7d4;
          auVar41._16_4_ = fVar170 * fStack_7d0;
          auVar41._20_4_ = fVar171 * fStack_7cc;
          auVar41._24_4_ = fVar172 * fStack_7c8;
          auVar41._28_4_ = 0;
          auVar163 = vsubps_avx(auVar41,ZEXT1632(auVar97));
          auVar194._0_4_ = (float)local_800._0_4_ * fVar245;
          auVar194._4_4_ = (float)local_800._4_4_ * fVar246;
          auVar194._8_4_ = fStack_7f8 * fVar247;
          auVar194._12_4_ = fStack_7f4 * fVar296;
          auVar194._16_4_ = fStack_7f0 * fVar170;
          auVar194._20_4_ = fStack_7ec * fVar171;
          auVar194._24_4_ = fStack_7e8 * fVar172;
          auVar194._28_4_ = 0;
          auVar193 = vsubps_avx(auVar194,ZEXT1632(auVar158));
          auVar228._0_4_ = (float)local_840._0_4_ * fVar245;
          auVar228._4_4_ = (float)local_840._4_4_ * fVar246;
          auVar228._8_4_ = fStack_838 * fVar247;
          auVar228._12_4_ = fStack_834 * fVar296;
          auVar228._16_4_ = fStack_830 * fVar170;
          auVar228._20_4_ = fStack_82c * fVar171;
          auVar228._24_4_ = fStack_828 * fVar172;
          auVar228._28_4_ = 0;
          auVar165 = vsubps_avx(auVar228,ZEXT1632(auVar284));
          auVar206 = auVar165._0_28_;
          auVar42._4_4_ = fVar234 * (float)local_7e0._4_4_;
          auVar42._0_4_ = fVar115 * (float)local_7e0._0_4_;
          auVar42._8_4_ = fVar242 * fStack_7d8;
          auVar42._12_4_ = fVar152 * fStack_7d4;
          auVar42._16_4_ = fVar243 * fStack_7d0;
          auVar42._20_4_ = fVar154 * fStack_7cc;
          auVar42._24_4_ = fVar244 * fStack_7c8;
          auVar42._28_4_ = 0;
          local_880 = vsubps_avx(auVar42,ZEXT1632(auVar202));
          auVar43._4_4_ = (float)local_800._4_4_ * fVar234;
          auVar43._0_4_ = (float)local_800._0_4_ * fVar115;
          auVar43._8_4_ = fStack_7f8 * fVar242;
          auVar43._12_4_ = fStack_7f4 * fVar152;
          auVar43._16_4_ = fStack_7f0 * fVar243;
          auVar43._20_4_ = fStack_7ec * fVar154;
          auVar43._24_4_ = fStack_7e8 * fVar244;
          auVar43._28_4_ = local_880._28_4_;
          _local_620 = vsubps_avx(auVar43,ZEXT1632(auVar99));
          auVar44._4_4_ = (float)local_840._4_4_ * fVar234;
          auVar44._0_4_ = (float)local_840._0_4_ * fVar115;
          auVar44._8_4_ = fStack_838 * fVar242;
          auVar44._12_4_ = fStack_834 * fVar152;
          auVar44._16_4_ = fStack_830 * fVar243;
          auVar44._20_4_ = fStack_82c * fVar154;
          auVar44._24_4_ = fStack_828 * fVar244;
          auVar44._28_4_ = local_620._28_4_;
          _local_640 = vsubps_avx(auVar44,ZEXT1632(auVar125));
          auVar165 = vcmpps_avx(auVar9,_DAT_02020f00,5);
          auVar229._8_4_ = 0x7f800000;
          auVar229._0_8_ = 0x7f8000007f800000;
          auVar229._12_4_ = 0x7f800000;
          auVar229._16_4_ = 0x7f800000;
          auVar229._20_4_ = 0x7f800000;
          auVar229._24_4_ = 0x7f800000;
          auVar229._28_4_ = 0x7f800000;
          auVar227 = vblendvps_avx(auVar229,auVar38,auVar165);
          auVar64._4_4_ = uStack_85c;
          auVar64._0_4_ = local_860;
          auVar64._8_4_ = uStack_858;
          auVar64._12_4_ = uStack_854;
          auVar64._16_4_ = uStack_850;
          auVar64._20_4_ = uStack_84c;
          auVar64._24_4_ = uStack_848;
          auVar64._28_4_ = uStack_844;
          auVar9 = vandps_avx(auVar64,local_5a0);
          auVar9 = vmaxps_avx(local_4a0,auVar9);
          auVar45._4_4_ = auVar9._4_4_ * 1.9073486e-06;
          auVar45._0_4_ = auVar9._0_4_ * 1.9073486e-06;
          auVar45._8_4_ = auVar9._8_4_ * 1.9073486e-06;
          auVar45._12_4_ = auVar9._12_4_ * 1.9073486e-06;
          auVar45._16_4_ = auVar9._16_4_ * 1.9073486e-06;
          auVar45._20_4_ = auVar9._20_4_ * 1.9073486e-06;
          auVar45._24_4_ = auVar9._24_4_ * 1.9073486e-06;
          auVar45._28_4_ = auVar9._28_4_;
          auVar9 = vandps_avx(auVar64,auVar10);
          auVar9 = vcmpps_avx(auVar9,auVar45,1);
          auVar241._8_4_ = 0xff800000;
          auVar241._0_8_ = 0xff800000ff800000;
          auVar241._12_4_ = 0xff800000;
          auVar241._16_4_ = 0xff800000;
          auVar241._20_4_ = 0xff800000;
          auVar241._24_4_ = 0xff800000;
          auVar241._28_4_ = 0xff800000;
          auVar240 = vblendvps_avx(auVar241,auVar39,auVar165);
          auVar10 = auVar165 & auVar9;
          _local_b00 = local_3c0;
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0x7f,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0xbf,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar10[0x1f] < '\0') {
            auVar111 = vandps_avx(auVar9,auVar165);
            auVar9 = vcmpps_avx(auVar8,ZEXT832(0) << 0x20,2);
            auVar283._8_4_ = 0xff800000;
            auVar283._0_8_ = 0xff800000ff800000;
            auVar283._12_4_ = 0xff800000;
            auVar283._16_4_ = 0xff800000;
            auVar283._20_4_ = 0xff800000;
            auVar283._24_4_ = 0xff800000;
            auVar283._28_4_ = 0xff800000;
            auVar286._8_4_ = 0x7f800000;
            auVar286._0_8_ = 0x7f8000007f800000;
            auVar286._12_4_ = 0x7f800000;
            auVar286._16_4_ = 0x7f800000;
            auVar286._20_4_ = 0x7f800000;
            auVar286._24_4_ = 0x7f800000;
            auVar286._28_4_ = 0x7f800000;
            auVar8 = vblendvps_avx(auVar286,auVar283,auVar9);
            auVar97 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
            auVar10 = vpmovsxwd_avx2(auVar97);
            auVar227 = vblendvps_avx(auVar227,auVar8,auVar10);
            auVar8 = vblendvps_avx(auVar283,auVar286,auVar9);
            auVar276 = ZEXT3264(auVar8);
            auVar240 = vblendvps_avx(auVar240,auVar8,auVar10);
            auVar262._0_8_ = auVar111._0_8_ ^ 0xffffffffffffffff;
            auVar262._8_4_ = auVar111._8_4_ ^ 0xffffffff;
            auVar262._12_4_ = auVar111._12_4_ ^ 0xffffffff;
            auVar262._16_4_ = auVar111._16_4_ ^ 0xffffffff;
            auVar262._20_4_ = auVar111._20_4_ ^ 0xffffffff;
            auVar262._24_4_ = auVar111._24_4_ ^ 0xffffffff;
            auVar262._28_4_ = auVar111._28_4_ ^ 0xffffffff;
            auVar111 = vorps_avx(auVar9,auVar262);
            auVar111 = vandps_avx(auVar111,auVar165);
          }
        }
        auVar268 = ZEXT3264(local_3c0);
        auVar272 = ZEXT3264(local_a40);
        auVar263 = ZEXT3264(auVar111);
        local_420 = local_a40;
        local_400 = vminps_avx(local_3c0,auVar227);
        _local_3e0 = vmaxps_avx(local_a40,auVar240);
        auVar255 = ZEXT3264(_local_3e0);
        auVar8 = vcmpps_avx(local_a40,local_400,2);
        local_520 = vandps_avx(auVar8,auVar103);
        auVar230 = ZEXT3264(local_520);
        local_5c0 = local_520;
        auVar8 = vcmpps_avx(_local_3e0,local_3c0,2);
        local_5e0 = vandps_avx(auVar8,auVar103);
        auVar103 = vorps_avx(local_5e0,local_520);
        if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar103 >> 0x7f,0) != '\0') ||
              (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar103 >> 0xbf,0) != '\0') ||
            (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar103[0x1f] < '\0') {
          local_560 = local_5e0;
          local_580._0_8_ = auVar111._0_8_ ^ 0xffffffffffffffff;
          local_580._8_4_ = auVar111._8_4_ ^ 0xffffffff;
          local_580._12_4_ = auVar111._12_4_ ^ 0xffffffff;
          local_580._16_4_ = auVar111._16_4_ ^ 0xffffffff;
          local_580._20_4_ = auVar111._20_4_ ^ 0xffffffff;
          local_580._24_4_ = auVar111._24_4_ ^ 0xffffffff;
          local_580._28_4_ = auVar111._28_4_ ^ 0xffffffff;
          auVar230 = ZEXT3264(local_580);
          auVar46._4_4_ = auVar206._4_4_ * (float)local_840._4_4_;
          auVar46._0_4_ = auVar206._0_4_ * (float)local_840._0_4_;
          auVar46._8_4_ = auVar206._8_4_ * fStack_838;
          auVar46._12_4_ = auVar206._12_4_ * fStack_834;
          auVar46._16_4_ = auVar206._16_4_ * fStack_830;
          auVar46._20_4_ = auVar206._20_4_ * fStack_82c;
          auVar46._24_4_ = auVar206._24_4_ * fStack_828;
          auVar46._28_4_ = auVar103._28_4_;
          auVar97 = vfmadd132ps_fma(auVar193,auVar46,_local_800);
          auVar97 = vfmadd132ps_fma(auVar163,ZEXT1632(auVar97),_local_7e0);
          auVar65._4_4_ = uStack_85c;
          auVar65._0_4_ = local_860;
          auVar65._8_4_ = uStack_858;
          auVar65._12_4_ = uStack_854;
          auVar65._16_4_ = uStack_850;
          auVar65._20_4_ = uStack_84c;
          auVar65._24_4_ = uStack_848;
          auVar65._28_4_ = uStack_844;
          auVar103 = vandps_avx(ZEXT1632(auVar97),auVar65);
          auVar141._8_4_ = 0x3e99999a;
          auVar141._0_8_ = 0x3e99999a3e99999a;
          auVar141._12_4_ = 0x3e99999a;
          auVar141._16_4_ = 0x3e99999a;
          auVar141._20_4_ = 0x3e99999a;
          auVar141._24_4_ = 0x3e99999a;
          auVar141._28_4_ = 0x3e99999a;
          auVar103 = vcmpps_avx(auVar103,auVar141,1);
          auVar103 = vorps_avx(auVar103,local_580);
          auVar142._8_4_ = 3;
          auVar142._0_8_ = 0x300000003;
          auVar142._12_4_ = 3;
          auVar142._16_4_ = 3;
          auVar142._20_4_ = 3;
          auVar142._24_4_ = 3;
          auVar142._28_4_ = 3;
          auVar166._8_4_ = 2;
          auVar166._0_8_ = 0x200000002;
          auVar166._12_4_ = 2;
          auVar166._16_4_ = 2;
          auVar166._20_4_ = 2;
          auVar166._24_4_ = 2;
          auVar166._28_4_ = 2;
          auVar103 = vblendvps_avx(auVar166,auVar142,auVar103);
          uVar86 = (undefined4)uVar87;
          local_5a0._4_4_ = uVar86;
          local_5a0._0_4_ = uVar86;
          local_5a0._8_4_ = uVar86;
          local_5a0._12_4_ = uVar86;
          local_5a0._16_4_ = uVar86;
          local_5a0._20_4_ = uVar86;
          local_5a0._24_4_ = uVar86;
          local_5a0._28_4_ = uVar86;
          local_540 = vpcmpgtd_avx2(auVar103,local_5a0);
          local_5c0 = vpandn_avx2(local_540,local_520);
          auVar103 = local_520 & ~local_540;
          local_600._0_8_ = uVar87;
          if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar103 >> 0x7f,0) != '\0') ||
                (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar103 >> 0xbf,0) != '\0') ||
              (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar103[0x1f] < '\0') {
            auVar197 = ZEXT3264(local_a40);
            auVar202 = vminps_avx(local_aa0,local_ac0);
            auVar97 = vmaxps_avx(local_aa0,local_ac0);
            auVar158 = vminps_avx(local_ab0,_local_ad0);
            auVar99 = vminps_avx(auVar202,auVar158);
            auVar202 = vmaxps_avx(local_ab0,_local_ad0);
            auVar158 = vmaxps_avx(auVar97,auVar202);
            auVar97 = vandps_avx(auVar99,local_940);
            auVar202 = vandps_avx(auVar158,local_940);
            auVar97 = vmaxps_avx(auVar97,auVar202);
            auVar202 = vmovshdup_avx(auVar97);
            auVar202 = vmaxss_avx(auVar202,auVar97);
            auVar97 = vshufpd_avx(auVar97,auVar97,1);
            auVar97 = vmaxss_avx(auVar97,auVar202);
            local_980._0_4_ = auVar97._0_4_ * 1.9073486e-06;
            _local_7c0 = vshufps_avx(auVar158,auVar158,0xff);
            _auStack_7b0 = auVar14._16_16_;
            local_820._4_4_ = local_a40._4_4_ + (float)local_7a0._4_4_;
            local_820._0_4_ = local_a40._0_4_ + (float)local_7a0._0_4_;
            fStack_818 = local_a40._8_4_ + fStack_798;
            fStack_814 = local_a40._12_4_ + fStack_794;
            fStack_810 = local_a40._16_4_ + fStack_790;
            fStack_80c = local_a40._20_4_ + fStack_78c;
            fStack_808 = local_a40._24_4_ + fStack_788;
            fStack_804 = local_a40._28_4_ + fStack_784;
            local_a60 = _local_3e0;
            do {
              auVar143._8_4_ = 0x7f800000;
              auVar143._0_8_ = 0x7f8000007f800000;
              auVar143._12_4_ = 0x7f800000;
              auVar143._16_4_ = 0x7f800000;
              auVar143._20_4_ = 0x7f800000;
              auVar143._24_4_ = 0x7f800000;
              auVar143._28_4_ = 0x7f800000;
              auVar103 = vblendvps_avx(auVar143,auVar197._0_32_,local_5c0);
              auVar111 = vshufps_avx(auVar103,auVar103,0xb1);
              auVar111 = vminps_avx(auVar103,auVar111);
              auVar8 = vshufpd_avx(auVar111,auVar111,5);
              auVar111 = vminps_avx(auVar111,auVar8);
              auVar8 = vpermpd_avx2(auVar111,0x4e);
              auVar111 = vminps_avx(auVar111,auVar8);
              auVar111 = vcmpps_avx(auVar103,auVar111,0);
              auVar8 = local_5c0 & auVar111;
              auVar103 = local_5c0;
              if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar8 >> 0x7f,0) != '\0') ||
                    (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar8 >> 0xbf,0) != '\0') ||
                  (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar8[0x1f] < '\0') {
                auVar103 = vandps_avx(auVar111,local_5c0);
              }
              uVar79 = vmovmskps_avx(auVar103);
              iVar15 = 0;
              for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                iVar15 = iVar15 + 1;
              }
              uVar80 = iVar15 << 2;
              *(undefined4 *)(local_5c0 + uVar80) = 0;
              uVar79 = *(uint *)(local_4e0 + uVar80);
              uVar80 = *(uint *)(local_420 + uVar80);
              fVar115 = local_b04;
              if ((float)local_950._0_4_ < 0.0) {
                fVar115 = sqrtf((float)local_950._0_4_);
              }
              auVar268 = ZEXT464(uVar80);
              auVar263 = ZEXT464(uVar79);
              local_8e0._0_4_ = fVar115 * 1.9073486e-06;
              lVar84 = 4;
              do {
                fVar151 = auVar263._0_4_;
                fVar234 = 1.0 - fVar151;
                local_9e0._0_16_ = ZEXT416((uint)fVar234);
                auVar119._0_4_ = local_ac0._0_4_ * fVar151;
                auVar119._4_4_ = local_ac0._4_4_ * fVar151;
                auVar119._8_4_ = local_ac0._8_4_ * fVar151;
                auVar119._12_4_ = local_ac0._12_4_ * fVar151;
                auVar157._4_4_ = fVar234;
                auVar157._0_4_ = fVar234;
                auVar157._8_4_ = fVar234;
                auVar157._12_4_ = fVar234;
                auVar97 = vfmadd231ps_fma(auVar119,auVar157,local_aa0);
                auVar174._0_4_ = local_ab0._0_4_ * fVar151;
                auVar174._4_4_ = local_ab0._4_4_ * fVar151;
                auVar174._8_4_ = local_ab0._8_4_ * fVar151;
                auVar174._12_4_ = local_ab0._12_4_ * fVar151;
                auVar202 = vfmadd231ps_fma(auVar174,auVar157,local_ac0);
                auVar220._0_4_ = fVar151 * auVar202._0_4_;
                auVar220._4_4_ = fVar151 * auVar202._4_4_;
                auVar220._8_4_ = fVar151 * auVar202._8_4_;
                auVar220._12_4_ = fVar151 * auVar202._12_4_;
                auVar158 = vfmadd231ps_fma(auVar220,auVar157,auVar97);
                auVar120._0_4_ = fVar151 * (float)local_ad0._0_4_;
                auVar120._4_4_ = fVar151 * (float)local_ad0._4_4_;
                auVar120._8_4_ = fVar151 * fStack_ac8;
                auVar120._12_4_ = fVar151 * fStack_ac4;
                auVar97 = vfmadd231ps_fma(auVar120,auVar157,local_ab0);
                auVar201._0_4_ = fVar151 * auVar97._0_4_;
                auVar201._4_4_ = fVar151 * auVar97._4_4_;
                auVar201._8_4_ = fVar151 * auVar97._8_4_;
                auVar201._12_4_ = fVar151 * auVar97._12_4_;
                auVar202 = vfmadd231ps_fma(auVar201,auVar157,auVar202);
                fVar115 = auVar268._0_4_;
                auVar121._4_4_ = fVar115;
                auVar121._0_4_ = fVar115;
                auVar121._8_4_ = fVar115;
                auVar121._12_4_ = fVar115;
                auVar97 = vfmadd213ps_fma(auVar121,local_930,_DAT_01feba10);
                auVar94._0_4_ = fVar151 * auVar202._0_4_;
                auVar94._4_4_ = fVar151 * auVar202._4_4_;
                auVar94._8_4_ = fVar151 * auVar202._8_4_;
                auVar94._12_4_ = fVar151 * auVar202._12_4_;
                auVar99 = vfmadd231ps_fma(auVar94,auVar158,auVar157);
                local_720._0_16_ = auVar99;
                auVar97 = vsubps_avx(auVar97,auVar99);
                _local_b00 = auVar97;
                auVar97 = vdpps_avx(auVar97,auVar97,0x7f);
                fVar242 = auVar97._0_4_;
                if (fVar242 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar234);
                  local_a00._0_16_ = auVar158;
                  local_9a0._0_16_ = auVar202;
                  auVar197._0_4_ = sqrtf(fVar242);
                  auVar197._4_60_ = extraout_var;
                  auVar99 = auVar197._0_16_;
                  auVar202 = local_9a0._0_16_;
                  auVar158 = local_a00._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar97,auVar97);
                }
                auVar202 = vsubps_avx(auVar202,auVar158);
                auVar236._0_4_ = auVar202._0_4_ * 3.0;
                auVar236._4_4_ = auVar202._4_4_ * 3.0;
                auVar236._8_4_ = auVar202._8_4_ * 3.0;
                auVar236._12_4_ = auVar202._12_4_ * 3.0;
                auVar202 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9e0._0_16_,
                                           auVar263._0_16_);
                auVar158 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar263._0_16_,
                                           local_9e0._0_16_);
                fVar234 = local_9e0._0_4_ * 6.0;
                fVar156 = auVar202._0_4_ * 6.0;
                fVar152 = auVar158._0_4_ * 6.0;
                fVar243 = fVar151 * 6.0;
                auVar175._0_4_ = fVar243 * (float)local_ad0._0_4_;
                auVar175._4_4_ = fVar243 * (float)local_ad0._4_4_;
                auVar175._8_4_ = fVar243 * fStack_ac8;
                auVar175._12_4_ = fVar243 * fStack_ac4;
                auVar122._4_4_ = fVar152;
                auVar122._0_4_ = fVar152;
                auVar122._8_4_ = fVar152;
                auVar122._12_4_ = fVar152;
                auVar202 = vfmadd132ps_fma(auVar122,auVar175,local_ab0);
                auVar176._4_4_ = fVar156;
                auVar176._0_4_ = fVar156;
                auVar176._8_4_ = fVar156;
                auVar176._12_4_ = fVar156;
                auVar202 = vfmadd132ps_fma(auVar176,auVar202,local_ac0);
                auVar158 = vdpps_avx(auVar236,auVar236,0x7f);
                auVar123._4_4_ = fVar234;
                auVar123._0_4_ = fVar234;
                auVar123._8_4_ = fVar234;
                auVar123._12_4_ = fVar234;
                auVar125 = vfmadd132ps_fma(auVar123,auVar202,local_aa0);
                auVar202 = vblendps_avx(auVar158,_DAT_01feba10,0xe);
                auVar284 = vrsqrtss_avx(auVar202,auVar202);
                fVar152 = auVar158._0_4_;
                fVar234 = auVar284._0_4_;
                auVar284 = vdpps_avx(auVar236,auVar125,0x7f);
                fVar234 = fVar234 * 1.5 + fVar152 * -0.5 * fVar234 * fVar234 * fVar234;
                auVar124._0_4_ = auVar125._0_4_ * fVar152;
                auVar124._4_4_ = auVar125._4_4_ * fVar152;
                auVar124._8_4_ = auVar125._8_4_ * fVar152;
                auVar124._12_4_ = auVar125._12_4_ * fVar152;
                fVar156 = auVar284._0_4_;
                auVar221._0_4_ = auVar236._0_4_ * fVar156;
                auVar221._4_4_ = auVar236._4_4_ * fVar156;
                auVar221._8_4_ = auVar236._8_4_ * fVar156;
                auVar221._12_4_ = auVar236._12_4_ * fVar156;
                auVar284 = vsubps_avx(auVar124,auVar221);
                auVar202 = vrcpss_avx(auVar202,auVar202);
                auVar125 = vfnmadd213ss_fma(auVar202,auVar158,ZEXT416(0x40000000));
                fVar156 = auVar202._0_4_ * auVar125._0_4_;
                auVar202 = vmaxss_avx(ZEXT416((uint)local_980._0_4_),
                                      ZEXT416((uint)(fVar115 * (float)local_8e0._0_4_)));
                auVar287 = ZEXT1664(auVar202);
                uVar87 = CONCAT44(auVar236._4_4_,auVar236._0_4_);
                local_a20._0_8_ = uVar87 ^ 0x8000000080000000;
                local_a20._8_4_ = -auVar236._8_4_;
                local_a20._12_4_ = -auVar236._12_4_;
                auVar177._0_4_ = fVar234 * auVar284._0_4_ * fVar156;
                auVar177._4_4_ = fVar234 * auVar284._4_4_ * fVar156;
                auVar177._8_4_ = fVar234 * auVar284._8_4_ * fVar156;
                auVar177._12_4_ = fVar234 * auVar284._12_4_ * fVar156;
                auVar266._0_4_ = auVar236._0_4_ * fVar234;
                auVar266._4_4_ = auVar236._4_4_ * fVar234;
                auVar266._8_4_ = auVar236._8_4_ * fVar234;
                auVar266._12_4_ = auVar236._12_4_ * fVar234;
                local_9e0._0_16_ = auVar236;
                local_a00._0_4_ = auVar202._0_4_;
                if (fVar152 < -fVar152) {
                  local_9a0._0_4_ = auVar99._0_4_;
                  local_900._0_16_ = auVar266;
                  local_920._0_16_ = auVar177;
                  fVar234 = sqrtf(fVar152);
                  auVar99 = ZEXT416((uint)local_9a0._0_4_);
                  auVar287 = ZEXT464((uint)local_a00._0_4_);
                  auVar177 = local_920._0_16_;
                  auVar266 = local_900._0_16_;
                }
                else {
                  auVar202 = vsqrtss_avx(auVar158,auVar158);
                  fVar234 = auVar202._0_4_;
                }
                auVar202 = vdpps_avx(_local_b00,auVar266,0x7f);
                auVar93 = vfmadd213ss_fma(ZEXT416((uint)local_980._0_4_),auVar99,auVar287._0_16_);
                auVar158 = vdpps_avx(local_a20._0_16_,auVar266,0x7f);
                auVar284 = vdpps_avx(_local_b00,auVar177,0x7f);
                auVar125 = vdpps_avx(local_930,auVar266,0x7f);
                auVar161 = vfmadd213ss_fma(ZEXT416((uint)(auVar99._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_980._0_4_ / fVar234)),auVar93
                                          );
                auVar95._0_4_ = auVar202._0_4_ * auVar202._0_4_;
                auVar95._4_4_ = auVar202._4_4_ * auVar202._4_4_;
                auVar95._8_4_ = auVar202._8_4_ * auVar202._8_4_;
                auVar95._12_4_ = auVar202._12_4_ * auVar202._12_4_;
                auVar99 = vdpps_avx(_local_b00,local_a20._0_16_,0x7f);
                auVar92 = vsubps_avx(auVar97,auVar95);
                auVar93 = vrsqrtss_avx(auVar92,auVar92);
                fVar156 = auVar92._0_4_;
                fVar234 = auVar93._0_4_;
                fVar234 = fVar234 * 1.5 + fVar156 * -0.5 * fVar234 * fVar234 * fVar234;
                auVar93 = vdpps_avx(_local_b00,local_930,0x7f);
                local_9a0._0_16_ = ZEXT416((uint)(auVar158._0_4_ + auVar284._0_4_));
                local_a20._0_16_ = vfnmadd231ss_fma(auVar99,auVar202,local_9a0._0_16_);
                auVar158 = vfnmadd231ss_fma(auVar93,auVar202,auVar125);
                if (fVar156 < 0.0) {
                  local_900._0_16_ = auVar202;
                  local_920._0_4_ = auVar161._0_4_;
                  local_740._0_16_ = auVar125;
                  local_760._0_4_ = fVar234;
                  local_780._0_16_ = auVar158;
                  fVar152 = sqrtf(fVar156);
                  auVar287 = ZEXT464((uint)local_a00._0_4_);
                  fVar234 = (float)local_760._0_4_;
                  auVar158 = local_780._0_16_;
                  auVar125 = local_740._0_16_;
                  auVar202 = local_900._0_16_;
                  fVar156 = (float)local_920._0_4_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar92,auVar92);
                  fVar152 = auVar99._0_4_;
                  fVar156 = auVar161._0_4_;
                }
                auVar276 = ZEXT1664(auVar97);
                auVar197 = ZEXT3264(local_a40);
                auVar255 = ZEXT3264(local_a60);
                auVar272 = ZEXT1664(local_9e0._0_16_);
                auVar99 = vpermilps_avx(local_720._0_16_,0xff);
                auVar93 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xff);
                auVar284 = vfmsub213ss_fma(local_a20._0_16_,ZEXT416((uint)fVar234),auVar93);
                auVar178._0_8_ = auVar125._0_8_ ^ 0x8000000080000000;
                auVar178._8_4_ = auVar125._8_4_ ^ 0x80000000;
                auVar178._12_4_ = auVar125._12_4_ ^ 0x80000000;
                auVar203._0_8_ = auVar284._0_8_ ^ 0x8000000080000000;
                auVar203._8_4_ = auVar284._8_4_ ^ 0x80000000;
                auVar203._12_4_ = auVar284._12_4_ ^ 0x80000000;
                auVar158 = ZEXT416((uint)(auVar158._0_4_ * fVar234));
                auVar284 = vfmsub231ss_fma(ZEXT416((uint)(auVar125._0_4_ * auVar284._0_4_)),
                                           local_9a0._0_16_,auVar158);
                auVar158 = vinsertps_avx(auVar158,auVar178,0x10);
                uVar86 = auVar284._0_4_;
                auVar179._4_4_ = uVar86;
                auVar179._0_4_ = uVar86;
                auVar179._8_4_ = uVar86;
                auVar179._12_4_ = uVar86;
                auVar158 = vdivps_avx(auVar158,auVar179);
                auVar125 = ZEXT416((uint)(fVar152 - auVar99._0_4_));
                auVar284 = vinsertps_avx(auVar202,auVar125,0x10);
                auVar230 = ZEXT1664(auVar284);
                auVar159._0_4_ = auVar284._0_4_ * auVar158._0_4_;
                auVar159._4_4_ = auVar284._4_4_ * auVar158._4_4_;
                auVar159._8_4_ = auVar284._8_4_ * auVar158._8_4_;
                auVar159._12_4_ = auVar284._12_4_ * auVar158._12_4_;
                auVar158 = vinsertps_avx(auVar203,local_9a0._0_16_,0x1c);
                auVar158 = vdivps_avx(auVar158,auVar179);
                auVar180._0_4_ = auVar284._0_4_ * auVar158._0_4_;
                auVar180._4_4_ = auVar284._4_4_ * auVar158._4_4_;
                auVar180._8_4_ = auVar284._8_4_ * auVar158._8_4_;
                auVar180._12_4_ = auVar284._12_4_ * auVar158._12_4_;
                auVar158 = vhaddps_avx(auVar159,auVar159);
                auVar99 = vhaddps_avx(auVar180,auVar180);
                fVar151 = fVar151 - auVar158._0_4_;
                auVar263 = ZEXT464((uint)fVar151);
                fVar115 = fVar115 - auVar99._0_4_;
                auVar268 = ZEXT464((uint)fVar115);
                auVar202 = vandps_avx(auVar202,local_940);
                if (fVar156 <= auVar202._0_4_) {
LAB_01639592:
                  bVar48 = false;
                }
                else {
                  auVar158 = vfmadd231ss_fma(ZEXT416((uint)(auVar287._0_4_ + fVar156)),_local_7c0,
                                             ZEXT416(0x36000000));
                  auVar202 = vandps_avx(auVar125,local_940);
                  if (auVar158._0_4_ <= auVar202._0_4_) goto LAB_01639592;
                  fVar115 = fVar115 + (float)local_8b0._0_4_;
                  auVar268 = ZEXT464((uint)fVar115);
                  bVar48 = true;
                  if ((((fVar89 <= fVar115) &&
                       (fVar234 = *(float *)(ray + k * 4 + 0x80), fVar115 <= fVar234)) &&
                      (0.0 <= fVar151)) && (fVar151 <= 1.0)) {
                    auVar202 = vrsqrtss_avx(auVar97,auVar97);
                    fVar156 = auVar202._0_4_;
                    auVar85 = (undefined1  [8])(context->scene->geometries).items[uVar83].ptr;
                    if ((((Geometry *)auVar85)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar242 = fVar156 * 1.5 + fVar242 * -0.5 * fVar156 * fVar156 * fVar156;
                      auVar126._0_4_ = fVar242 * (float)local_b00._0_4_;
                      auVar126._4_4_ = fVar242 * (float)local_b00._4_4_;
                      auVar126._8_4_ = fVar242 * fStack_af8;
                      auVar126._12_4_ = fVar242 * fStack_af4;
                      auVar125 = vfmadd213ps_fma(auVar93,auVar126,local_9e0._0_16_);
                      auVar202 = vshufps_avx(auVar126,auVar126,0xc9);
                      auVar158 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xc9);
                      auVar127._0_4_ = auVar126._0_4_ * auVar158._0_4_;
                      auVar127._4_4_ = auVar126._4_4_ * auVar158._4_4_;
                      auVar127._8_4_ = auVar126._8_4_ * auVar158._8_4_;
                      auVar127._12_4_ = auVar126._12_4_ * auVar158._12_4_;
                      auVar99 = vfmsub231ps_fma(auVar127,local_9e0._0_16_,auVar202);
                      auVar202 = vshufps_avx(auVar99,auVar99,0xc9);
                      auVar158 = vshufps_avx(auVar125,auVar125,0xc9);
                      auVar99 = vshufps_avx(auVar99,auVar99,0xd2);
                      auVar96._0_4_ = auVar125._0_4_ * auVar99._0_4_;
                      auVar96._4_4_ = auVar125._4_4_ * auVar99._4_4_;
                      auVar96._8_4_ = auVar125._8_4_ * auVar99._8_4_;
                      auVar96._12_4_ = auVar125._12_4_ * auVar99._12_4_;
                      auVar202 = vfmsub231ps_fma(auVar96,auVar202,auVar158);
                      uVar86 = auVar202._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar85)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar115;
                        uVar4 = vextractps_avx(auVar202,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                        uVar4 = vextractps_avx(auVar202,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar86;
                        *(float *)(ray + k * 4 + 0xf0) = fVar151;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x110) = uVar1;
                        *(uint *)(ray + k * 4 + 0x120) = uVar83;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar128._4_4_ = fVar151;
                        auVar128._0_4_ = fVar151;
                        auVar128._8_4_ = fVar151;
                        auVar128._12_4_ = fVar151;
                        local_6e0 = (RTCHitN  [16])vshufps_avx(auVar202,auVar202,0x55);
                        auVar202 = vshufps_avx(auVar202,auVar202,0xaa);
                        auStack_6d0 = auVar202;
                        local_6c0 = uVar86;
                        uStack_6bc = uVar86;
                        uStack_6b8 = uVar86;
                        uStack_6b4 = uVar86;
                        local_6b0 = auVar128;
                        local_6a0 = ZEXT416(0) << 0x20;
                        local_690 = CONCAT44(uStack_6fc,local_700);
                        uStack_688 = CONCAT44(uStack_6f4,uStack_6f8);
                        local_680._4_4_ = uStack_6ec;
                        local_680._0_4_ = local_6f0;
                        local_680._8_4_ = uStack_6e8;
                        local_680._12_4_ = uStack_6e4;
                        vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                        uStack_66c = context->user->instID[0];
                        local_670 = uStack_66c;
                        uStack_668 = uStack_66c;
                        uStack_664 = uStack_66c;
                        uStack_660 = context->user->instPrimID[0];
                        uStack_65c = uStack_660;
                        uStack_658 = uStack_660;
                        uStack_654 = uStack_660;
                        *(float *)(ray + k * 4 + 0x80) = fVar115;
                        local_b20 = *local_9a8;
                        uStack_b18 = local_9a8[1];
                        local_a90.valid = (int *)&local_b20;
                        local_a90.geometryUserPtr = ((Geometry *)auVar85)->userPtr;
                        local_a90.context = context->user;
                        local_a90.hit = local_6e0;
                        local_a90.N = 4;
                        local_a90.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar85)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          local_b00 = auVar85;
                          auVar230 = ZEXT1664(auVar284);
                          auVar272 = ZEXT1664(local_9e0._0_16_);
                          auVar276 = ZEXT1664(auVar97);
                          (*((Geometry *)auVar85)->intersectionFilterN)(&local_a90);
                          auVar263._8_56_ = extraout_var_01;
                          auVar263._0_8_ = extraout_XMM1_Qa;
                          auVar128 = auVar263._0_16_;
                          auVar268 = ZEXT1664(ZEXT416((uint)fVar115));
                          auVar263 = ZEXT1664(ZEXT416((uint)fVar151));
                          auVar255 = ZEXT3264(local_a60);
                          auVar197 = ZEXT3264(local_a40);
                          auVar85 = local_b00;
                        }
                        auVar56._8_8_ = uStack_b18;
                        auVar56._0_8_ = local_b20;
                        if (auVar56 == (undefined1  [16])0x0) {
                          auVar97 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar202 = vpcmpeqd_avx(auVar128,auVar128);
                          auVar97 = auVar97 ^ auVar202;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar202 = vpcmpeqd_avx(auVar202,auVar202);
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar85)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar230 = ZEXT1664(auVar230._0_16_);
                            auVar272 = ZEXT1664(auVar272._0_16_);
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            (*p_Var5)(&local_a90);
                            auVar268 = ZEXT1664(ZEXT416((uint)fVar115));
                            auVar263 = ZEXT1664(ZEXT416((uint)fVar151));
                            auVar255 = ZEXT3264(local_a60);
                            auVar197 = ZEXT3264(local_a40);
                            auVar202 = vpcmpeqd_avx(auVar202,auVar202);
                          }
                          auVar57._8_8_ = uStack_b18;
                          auVar57._0_8_ = local_b20;
                          auVar158 = vpcmpeqd_avx(auVar57,_DAT_01feba10);
                          auVar97 = auVar158 ^ auVar202;
                          if (auVar57 != (undefined1  [16])0x0) {
                            auVar158 = auVar158 ^ auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])local_a90.hit);
                            *(undefined1 (*) [16])(local_a90.ray + 0xc0) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x10));
                            *(undefined1 (*) [16])(local_a90.ray + 0xd0) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x20));
                            *(undefined1 (*) [16])(local_a90.ray + 0xe0) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x30));
                            *(undefined1 (*) [16])(local_a90.ray + 0xf0) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x40));
                            *(undefined1 (*) [16])(local_a90.ray + 0x100) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x50));
                            *(undefined1 (*) [16])(local_a90.ray + 0x110) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x60));
                            *(undefined1 (*) [16])(local_a90.ray + 0x120) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x70));
                            *(undefined1 (*) [16])(local_a90.ray + 0x130) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x80));
                            *(undefined1 (*) [16])(local_a90.ray + 0x140) = auVar202;
                          }
                        }
                        auVar129._8_8_ = 0x100000001;
                        auVar129._0_8_ = 0x100000001;
                        if ((auVar129 & auVar97) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar234;
                        }
                      }
                    }
                  }
                }
                auVar103 = local_5c0;
                bVar88 = lVar84 != 0;
                lVar84 = lVar84 + -1;
              } while ((!bVar48) && (bVar88));
              uVar86 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar108._4_4_ = uVar86;
              auVar108._0_4_ = uVar86;
              auVar108._8_4_ = uVar86;
              auVar108._12_4_ = uVar86;
              auVar108._16_4_ = uVar86;
              auVar108._20_4_ = uVar86;
              auVar108._24_4_ = uVar86;
              auVar108._28_4_ = uVar86;
              auVar111 = vcmpps_avx(_local_820,auVar108,2);
              local_5c0 = vandps_avx(auVar111,local_5c0);
              auVar103 = auVar103 & auVar111;
              uVar87 = local_600._0_8_;
            } while ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar103 >> 0x7f,0) != '\0') ||
                       (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar103 >> 0xbf,0) != '\0') ||
                     (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar103[0x1f] < '\0');
          }
          auVar47._4_4_ = (float)local_640._4_4_ * (float)local_840._4_4_;
          auVar47._0_4_ = (float)local_640._0_4_ * (float)local_840._0_4_;
          auVar47._8_4_ = fStack_638 * fStack_838;
          auVar47._12_4_ = fStack_634 * fStack_834;
          auVar47._16_4_ = fStack_630 * fStack_830;
          auVar47._20_4_ = fStack_62c * fStack_82c;
          auVar47._24_4_ = fStack_628 * fStack_828;
          auVar47._28_4_ = uStack_624;
          auVar97 = vfmadd132ps_fma(_local_620,auVar47,_local_800);
          auVar97 = vfmadd132ps_fma(local_880,ZEXT1632(auVar97),_local_7e0);
          auVar66._4_4_ = uStack_85c;
          auVar66._0_4_ = local_860;
          auVar66._8_4_ = uStack_858;
          auVar66._12_4_ = uStack_854;
          auVar66._16_4_ = uStack_850;
          auVar66._20_4_ = uStack_84c;
          auVar66._24_4_ = uStack_848;
          auVar66._28_4_ = uStack_844;
          auVar103 = vandps_avx(ZEXT1632(auVar97),auVar66);
          auVar144._8_4_ = 0x3e99999a;
          auVar144._0_8_ = 0x3e99999a3e99999a;
          auVar144._12_4_ = 0x3e99999a;
          auVar144._16_4_ = 0x3e99999a;
          auVar144._20_4_ = 0x3e99999a;
          auVar144._24_4_ = 0x3e99999a;
          auVar144._28_4_ = 0x3e99999a;
          auVar103 = vcmpps_avx(auVar103,auVar144,1);
          auVar111 = vorps_avx(auVar103,local_580);
          auVar145._0_4_ = auVar255._0_4_ + (float)local_7a0._0_4_;
          auVar145._4_4_ = auVar255._4_4_ + (float)local_7a0._4_4_;
          auVar145._8_4_ = auVar255._8_4_ + fStack_798;
          auVar145._12_4_ = auVar255._12_4_ + fStack_794;
          auVar145._16_4_ = auVar255._16_4_ + fStack_790;
          auVar145._20_4_ = auVar255._20_4_ + fStack_78c;
          auVar145._24_4_ = auVar255._24_4_ + fStack_788;
          auVar145._28_4_ = auVar255._28_4_ + fStack_784;
          uVar86 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar167._4_4_ = uVar86;
          auVar167._0_4_ = uVar86;
          auVar167._8_4_ = uVar86;
          auVar167._12_4_ = uVar86;
          auVar167._16_4_ = uVar86;
          auVar167._20_4_ = uVar86;
          auVar167._24_4_ = uVar86;
          auVar167._28_4_ = uVar86;
          auVar103 = vcmpps_avx(auVar145,auVar167,2);
          _local_820 = vandps_avx(auVar103,local_560);
          auVar146._8_4_ = 3;
          auVar146._0_8_ = 0x300000003;
          auVar146._12_4_ = 3;
          auVar146._16_4_ = 3;
          auVar146._20_4_ = 3;
          auVar146._24_4_ = 3;
          auVar146._28_4_ = 3;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar103 = vblendvps_avx(auVar168,auVar146,auVar111);
          local_880 = vpcmpgtd_avx2(auVar103,local_5a0);
          local_5e0 = vpandn_avx2(local_880,_local_820);
          auVar103 = _local_820 & ~local_880;
          if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar103 >> 0x7f,0) != '\0') ||
                (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar103 >> 0xbf,0) != '\0') ||
              (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar103[0x1f] < '\0') {
            auVar202 = vminps_avx(local_aa0,local_ac0);
            auVar97 = vmaxps_avx(local_aa0,local_ac0);
            auVar158 = vminps_avx(local_ab0,_local_ad0);
            auVar99 = vminps_avx(auVar202,auVar158);
            auVar202 = vmaxps_avx(local_ab0,_local_ad0);
            auVar158 = vmaxps_avx(auVar97,auVar202);
            auVar97 = vandps_avx(auVar99,local_940);
            auVar202 = vandps_avx(auVar158,local_940);
            auVar97 = vmaxps_avx(auVar97,auVar202);
            auVar202 = vmovshdup_avx(auVar97);
            auVar202 = vmaxss_avx(auVar202,auVar97);
            auVar97 = vshufpd_avx(auVar97,auVar97,1);
            auVar97 = vmaxss_avx(auVar97,auVar202);
            local_980._0_4_ = auVar97._0_4_ * 1.9073486e-06;
            local_760._0_16_ = vshufps_avx(auVar158,auVar158,0xff);
            local_780 = _local_3e0;
            local_7c0._4_4_ = (float)local_3e0._4_4_ + (float)local_7a0._4_4_;
            local_7c0._0_4_ = (float)local_3e0._0_4_ + (float)local_7a0._0_4_;
            fStack_7b8 = fStack_3d8 + fStack_798;
            fStack_7b4 = fStack_3d4 + fStack_794;
            auStack_7b0._0_4_ = fStack_3d0 + fStack_790;
            auStack_7b0._4_4_ = fStack_3cc + fStack_78c;
            fStack_7a8 = fStack_3c8 + fStack_788;
            fStack_7a4 = fStack_3c4 + fStack_784;
            do {
              auVar147._8_4_ = 0x7f800000;
              auVar147._0_8_ = 0x7f8000007f800000;
              auVar147._12_4_ = 0x7f800000;
              auVar147._16_4_ = 0x7f800000;
              auVar147._20_4_ = 0x7f800000;
              auVar147._24_4_ = 0x7f800000;
              auVar147._28_4_ = 0x7f800000;
              auVar103 = vblendvps_avx(auVar147,local_780,local_5e0);
              auVar111 = vshufps_avx(auVar103,auVar103,0xb1);
              auVar111 = vminps_avx(auVar103,auVar111);
              auVar8 = vshufpd_avx(auVar111,auVar111,5);
              auVar111 = vminps_avx(auVar111,auVar8);
              auVar8 = vpermpd_avx2(auVar111,0x4e);
              auVar111 = vminps_avx(auVar111,auVar8);
              auVar111 = vcmpps_avx(auVar103,auVar111,0);
              auVar8 = local_5e0 & auVar111;
              auVar103 = local_5e0;
              if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar8 >> 0x7f,0) != '\0') ||
                    (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar8 >> 0xbf,0) != '\0') ||
                  (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar8[0x1f] < '\0') {
                auVar103 = vandps_avx(auVar111,local_5e0);
              }
              uVar79 = vmovmskps_avx(auVar103);
              iVar15 = 0;
              for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                iVar15 = iVar15 + 1;
              }
              uVar80 = iVar15 << 2;
              *(undefined4 *)(local_5e0 + uVar80) = 0;
              uVar79 = *(uint *)(local_500 + uVar80);
              uVar80 = *(uint *)(local_3c0 + uVar80);
              fVar115 = local_b08;
              if ((float)local_950._0_4_ < 0.0) {
                fVar115 = sqrtf((float)local_950._0_4_);
              }
              auVar255 = ZEXT464(uVar80);
              auVar197 = ZEXT464(uVar79);
              local_9a0._0_4_ = fVar115 * 1.9073486e-06;
              lVar84 = 4;
              do {
                fVar151 = auVar197._0_4_;
                fVar234 = 1.0 - fVar151;
                local_9e0._0_16_ = ZEXT416((uint)fVar234);
                auVar130._0_4_ = local_ac0._0_4_ * fVar151;
                auVar130._4_4_ = local_ac0._4_4_ * fVar151;
                auVar130._8_4_ = local_ac0._8_4_ * fVar151;
                auVar130._12_4_ = local_ac0._12_4_ * fVar151;
                auVar160._4_4_ = fVar234;
                auVar160._0_4_ = fVar234;
                auVar160._8_4_ = fVar234;
                auVar160._12_4_ = fVar234;
                auVar97 = vfmadd231ps_fma(auVar130,auVar160,local_aa0);
                auVar181._0_4_ = local_ab0._0_4_ * fVar151;
                auVar181._4_4_ = local_ab0._4_4_ * fVar151;
                auVar181._8_4_ = local_ab0._8_4_ * fVar151;
                auVar181._12_4_ = local_ab0._12_4_ * fVar151;
                auVar202 = vfmadd231ps_fma(auVar181,auVar160,local_ac0);
                auVar222._0_4_ = fVar151 * auVar202._0_4_;
                auVar222._4_4_ = fVar151 * auVar202._4_4_;
                auVar222._8_4_ = fVar151 * auVar202._8_4_;
                auVar222._12_4_ = fVar151 * auVar202._12_4_;
                auVar158 = vfmadd231ps_fma(auVar222,auVar160,auVar97);
                auVar131._0_4_ = fVar151 * (float)local_ad0._0_4_;
                auVar131._4_4_ = fVar151 * (float)local_ad0._4_4_;
                auVar131._8_4_ = fVar151 * fStack_ac8;
                auVar131._12_4_ = fVar151 * fStack_ac4;
                auVar97 = vfmadd231ps_fma(auVar131,auVar160,local_ab0);
                auVar204._0_4_ = fVar151 * auVar97._0_4_;
                auVar204._4_4_ = fVar151 * auVar97._4_4_;
                auVar204._8_4_ = fVar151 * auVar97._8_4_;
                auVar204._12_4_ = fVar151 * auVar97._12_4_;
                auVar202 = vfmadd231ps_fma(auVar204,auVar160,auVar202);
                fVar115 = auVar255._0_4_;
                auVar132._4_4_ = fVar115;
                auVar132._0_4_ = fVar115;
                auVar132._8_4_ = fVar115;
                auVar132._12_4_ = fVar115;
                auVar97 = vfmadd213ps_fma(auVar132,local_930,_DAT_01feba10);
                auVar98._0_4_ = fVar151 * auVar202._0_4_;
                auVar98._4_4_ = fVar151 * auVar202._4_4_;
                auVar98._8_4_ = fVar151 * auVar202._8_4_;
                auVar98._12_4_ = fVar151 * auVar202._12_4_;
                auVar99 = vfmadd231ps_fma(auVar98,auVar158,auVar160);
                local_720._0_16_ = auVar99;
                auVar97 = vsubps_avx(auVar97,auVar99);
                _local_b00 = auVar97;
                auVar97 = vdpps_avx(auVar97,auVar97,0x7f);
                fVar242 = auVar97._0_4_;
                if (fVar242 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar234);
                  local_a00._0_16_ = auVar158;
                  local_a20._0_16_ = auVar202;
                  auVar114._0_4_ = sqrtf(fVar242);
                  auVar114._4_60_ = extraout_var_00;
                  auVar99 = auVar114._0_16_;
                  auVar202 = local_a20._0_16_;
                  auVar158 = local_a00._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar97,auVar97);
                }
                auVar202 = vsubps_avx(auVar202,auVar158);
                auVar259._0_4_ = auVar202._0_4_ * 3.0;
                auVar259._4_4_ = auVar202._4_4_ * 3.0;
                auVar259._8_4_ = auVar202._8_4_ * 3.0;
                auVar259._12_4_ = auVar202._12_4_ * 3.0;
                auVar202 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9e0._0_16_,
                                           auVar197._0_16_);
                auVar158 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar197._0_16_,
                                           local_9e0._0_16_);
                fVar234 = local_9e0._0_4_ * 6.0;
                fVar156 = auVar202._0_4_ * 6.0;
                fVar152 = auVar158._0_4_ * 6.0;
                fVar243 = fVar151 * 6.0;
                auVar182._0_4_ = fVar243 * (float)local_ad0._0_4_;
                auVar182._4_4_ = fVar243 * (float)local_ad0._4_4_;
                auVar182._8_4_ = fVar243 * fStack_ac8;
                auVar182._12_4_ = fVar243 * fStack_ac4;
                auVar133._4_4_ = fVar152;
                auVar133._0_4_ = fVar152;
                auVar133._8_4_ = fVar152;
                auVar133._12_4_ = fVar152;
                auVar202 = vfmadd132ps_fma(auVar133,auVar182,local_ab0);
                auVar183._4_4_ = fVar156;
                auVar183._0_4_ = fVar156;
                auVar183._8_4_ = fVar156;
                auVar183._12_4_ = fVar156;
                auVar202 = vfmadd132ps_fma(auVar183,auVar202,local_ac0);
                auVar158 = vdpps_avx(auVar259,auVar259,0x7f);
                auVar134._4_4_ = fVar234;
                auVar134._0_4_ = fVar234;
                auVar134._8_4_ = fVar234;
                auVar134._12_4_ = fVar234;
                auVar125 = vfmadd132ps_fma(auVar134,auVar202,local_aa0);
                auVar202 = vblendps_avx(auVar158,_DAT_01feba10,0xe);
                auVar284 = vrsqrtss_avx(auVar202,auVar202);
                fVar152 = auVar158._0_4_;
                fVar234 = auVar284._0_4_;
                auVar284 = vdpps_avx(auVar259,auVar125,0x7f);
                fVar234 = fVar234 * 1.5 + fVar152 * -0.5 * fVar234 * fVar234 * fVar234;
                auVar135._0_4_ = auVar125._0_4_ * fVar152;
                auVar135._4_4_ = auVar125._4_4_ * fVar152;
                auVar135._8_4_ = auVar125._8_4_ * fVar152;
                auVar135._12_4_ = auVar125._12_4_ * fVar152;
                fVar156 = auVar284._0_4_;
                auVar223._0_4_ = auVar259._0_4_ * fVar156;
                auVar223._4_4_ = auVar259._4_4_ * fVar156;
                auVar223._8_4_ = auVar259._8_4_ * fVar156;
                auVar223._12_4_ = auVar259._12_4_ * fVar156;
                auVar284 = vsubps_avx(auVar135,auVar223);
                auVar202 = vrcpss_avx(auVar202,auVar202);
                auVar125 = vfnmadd213ss_fma(auVar202,auVar158,ZEXT416(0x40000000));
                fVar156 = auVar202._0_4_ * auVar125._0_4_;
                auVar202 = vmaxss_avx(ZEXT416((uint)local_980._0_4_),
                                      ZEXT416((uint)(fVar115 * (float)local_9a0._0_4_)));
                auVar272 = ZEXT1664(auVar202);
                uVar87 = CONCAT44(auVar259._4_4_,auVar259._0_4_);
                auVar237._0_8_ = uVar87 ^ 0x8000000080000000;
                auVar237._8_4_ = -auVar259._8_4_;
                auVar237._12_4_ = -auVar259._12_4_;
                auVar184._0_4_ = fVar234 * auVar284._0_4_ * fVar156;
                auVar184._4_4_ = fVar234 * auVar284._4_4_ * fVar156;
                auVar184._8_4_ = fVar234 * auVar284._8_4_ * fVar156;
                auVar184._12_4_ = fVar234 * auVar284._12_4_ * fVar156;
                auVar249._0_4_ = auVar259._0_4_ * fVar234;
                auVar249._4_4_ = auVar259._4_4_ * fVar234;
                auVar249._8_4_ = auVar259._8_4_ * fVar234;
                auVar249._12_4_ = auVar259._12_4_ * fVar234;
                local_9e0._0_16_ = auVar259;
                local_a00._0_4_ = auVar202._0_4_;
                if (fVar152 < -fVar152) {
                  local_a20._0_4_ = auVar99._0_4_;
                  local_8e0._0_16_ = auVar237;
                  local_a40._0_16_ = auVar249;
                  local_a60._0_16_ = auVar184;
                  fVar234 = sqrtf(fVar152);
                  auVar99 = ZEXT416((uint)local_a20._0_4_);
                  auVar272 = ZEXT464((uint)local_a00._0_4_);
                  auVar184 = local_a60._0_16_;
                  auVar237 = local_8e0._0_16_;
                  auVar249 = local_a40._0_16_;
                }
                else {
                  auVar202 = vsqrtss_avx(auVar158,auVar158);
                  fVar234 = auVar202._0_4_;
                }
                auVar202 = vdpps_avx(_local_b00,auVar249,0x7f);
                auVar93 = vfmadd213ss_fma(ZEXT416((uint)local_980._0_4_),auVar99,auVar272._0_16_);
                auVar158 = vdpps_avx(auVar237,auVar249,0x7f);
                auVar284 = vdpps_avx(_local_b00,auVar184,0x7f);
                auVar125 = vdpps_avx(local_930,auVar249,0x7f);
                auVar93 = vfmadd213ss_fma(ZEXT416((uint)(auVar99._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_980._0_4_ / fVar234)),auVar93)
                ;
                auVar276 = ZEXT1664(auVar93);
                fVar234 = auVar158._0_4_ + auVar284._0_4_;
                auVar100._0_4_ = auVar202._0_4_ * auVar202._0_4_;
                auVar100._4_4_ = auVar202._4_4_ * auVar202._4_4_;
                auVar100._8_4_ = auVar202._8_4_ * auVar202._8_4_;
                auVar100._12_4_ = auVar202._12_4_ * auVar202._12_4_;
                auVar158 = vdpps_avx(_local_b00,auVar237,0x7f);
                auVar284 = vsubps_avx(auVar97,auVar100);
                auVar99 = vrsqrtss_avx(auVar284,auVar284);
                fVar152 = auVar284._0_4_;
                fVar156 = auVar99._0_4_;
                fVar156 = fVar156 * 1.5 + fVar152 * -0.5 * fVar156 * fVar156 * fVar156;
                auVar99 = vdpps_avx(_local_b00,local_930,0x7f);
                auVar158 = vfnmadd231ss_fma(auVar158,auVar202,ZEXT416((uint)fVar234));
                auVar99 = vfnmadd231ss_fma(auVar99,auVar202,auVar125);
                if (fVar152 < 0.0) {
                  local_a20._0_16_ = auVar202;
                  local_8e0._0_4_ = auVar93._0_4_;
                  local_a40._0_16_ = ZEXT416((uint)fVar234);
                  local_a60._0_16_ = auVar125;
                  local_900._0_16_ = auVar158;
                  local_920._0_4_ = fVar156;
                  local_740._0_16_ = auVar99;
                  fVar152 = sqrtf(fVar152);
                  auVar276 = ZEXT464((uint)local_8e0._0_4_);
                  auVar272 = ZEXT464((uint)local_a00._0_4_);
                  fVar156 = (float)local_920._0_4_;
                  auVar99 = local_740._0_16_;
                  auVar202 = local_a20._0_16_;
                  auVar125 = local_a60._0_16_;
                  auVar158 = local_900._0_16_;
                  auVar284 = local_a40._0_16_;
                }
                else {
                  auVar284 = vsqrtss_avx(auVar284,auVar284);
                  fVar152 = auVar284._0_4_;
                  auVar284 = ZEXT416((uint)fVar234);
                }
                auVar268 = ZEXT1664(auVar97);
                auVar263 = ZEXT1664(local_9e0._0_16_);
                auVar92 = vpermilps_avx(local_720._0_16_,0xff);
                auVar93 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xff);
                auVar158 = vfmsub213ss_fma(auVar158,ZEXT416((uint)fVar156),auVar93);
                auVar185._0_8_ = auVar125._0_8_ ^ 0x8000000080000000;
                auVar185._8_4_ = auVar125._8_4_ ^ 0x80000000;
                auVar185._12_4_ = auVar125._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar158._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar158._12_4_ ^ 0x80000000;
                auVar161 = ZEXT416((uint)(auVar99._0_4_ * fVar156));
                auVar99 = vfmsub231ss_fma(ZEXT416((uint)(auVar125._0_4_ * auVar158._0_4_)),auVar284,
                                          auVar161);
                auVar158 = vinsertps_avx(auVar161,auVar185,0x10);
                uVar86 = auVar99._0_4_;
                auVar186._4_4_ = uVar86;
                auVar186._0_4_ = uVar86;
                auVar186._8_4_ = uVar86;
                auVar186._12_4_ = uVar86;
                auVar158 = vdivps_avx(auVar158,auVar186);
                auVar92 = ZEXT416((uint)(fVar152 - auVar92._0_4_));
                auVar125 = vinsertps_avx(auVar202,auVar92,0x10);
                auVar230 = ZEXT1664(auVar125);
                auVar162._0_4_ = auVar125._0_4_ * auVar158._0_4_;
                auVar162._4_4_ = auVar125._4_4_ * auVar158._4_4_;
                auVar162._8_4_ = auVar125._8_4_ * auVar158._8_4_;
                auVar162._12_4_ = auVar125._12_4_ * auVar158._12_4_;
                auVar158 = vinsertps_avx(auVar205,auVar284,0x1c);
                auVar158 = vdivps_avx(auVar158,auVar186);
                auVar187._0_4_ = auVar125._0_4_ * auVar158._0_4_;
                auVar187._4_4_ = auVar125._4_4_ * auVar158._4_4_;
                auVar187._8_4_ = auVar125._8_4_ * auVar158._8_4_;
                auVar187._12_4_ = auVar125._12_4_ * auVar158._12_4_;
                auVar158 = vhaddps_avx(auVar162,auVar162);
                auVar99 = vhaddps_avx(auVar187,auVar187);
                fVar151 = fVar151 - auVar158._0_4_;
                auVar197 = ZEXT464((uint)fVar151);
                fVar115 = fVar115 - auVar99._0_4_;
                auVar255 = ZEXT464((uint)fVar115);
                auVar202 = vandps_avx(auVar202,local_940);
                if (auVar276._0_4_ <= auVar202._0_4_) {
LAB_0163a0f6:
                  bVar48 = false;
                }
                else {
                  auVar158 = vfmadd231ss_fma(ZEXT416((uint)(auVar272._0_4_ + auVar276._0_4_)),
                                             local_760._0_16_,ZEXT416(0x36000000));
                  auVar202 = vandps_avx(auVar92,local_940);
                  if (auVar158._0_4_ <= auVar202._0_4_) goto LAB_0163a0f6;
                  fVar115 = fVar115 + (float)local_8b0._0_4_;
                  auVar255 = ZEXT464((uint)fVar115);
                  bVar48 = true;
                  if ((((fVar89 <= fVar115) &&
                       (fVar234 = *(float *)(ray + k * 4 + 0x80), fVar115 <= fVar234)) &&
                      (0.0 <= fVar151)) && (fVar151 <= 1.0)) {
                    auVar202 = vrsqrtss_avx(auVar97,auVar97);
                    fVar156 = auVar202._0_4_;
                    auVar85 = (undefined1  [8])(context->scene->geometries).items[uVar83].ptr;
                    if ((((Geometry *)auVar85)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar242 = fVar156 * 1.5 + fVar242 * -0.5 * fVar156 * fVar156 * fVar156;
                      auVar136._0_4_ = fVar242 * (float)local_b00._0_4_;
                      auVar136._4_4_ = fVar242 * (float)local_b00._4_4_;
                      auVar136._8_4_ = fVar242 * fStack_af8;
                      auVar136._12_4_ = fVar242 * fStack_af4;
                      auVar284 = vfmadd213ps_fma(auVar93,auVar136,local_9e0._0_16_);
                      auVar202 = vshufps_avx(auVar136,auVar136,0xc9);
                      auVar158 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xc9);
                      auVar137._0_4_ = auVar136._0_4_ * auVar158._0_4_;
                      auVar137._4_4_ = auVar136._4_4_ * auVar158._4_4_;
                      auVar137._8_4_ = auVar136._8_4_ * auVar158._8_4_;
                      auVar137._12_4_ = auVar136._12_4_ * auVar158._12_4_;
                      auVar99 = vfmsub231ps_fma(auVar137,local_9e0._0_16_,auVar202);
                      auVar202 = vshufps_avx(auVar99,auVar99,0xc9);
                      auVar158 = vshufps_avx(auVar284,auVar284,0xc9);
                      auVar99 = vshufps_avx(auVar99,auVar99,0xd2);
                      auVar101._0_4_ = auVar284._0_4_ * auVar99._0_4_;
                      auVar101._4_4_ = auVar284._4_4_ * auVar99._4_4_;
                      auVar101._8_4_ = auVar284._8_4_ * auVar99._8_4_;
                      auVar101._12_4_ = auVar284._12_4_ * auVar99._12_4_;
                      auVar202 = vfmsub231ps_fma(auVar101,auVar202,auVar158);
                      uVar86 = auVar202._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar85)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar115;
                        uVar4 = vextractps_avx(auVar202,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                        uVar4 = vextractps_avx(auVar202,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar86;
                        *(float *)(ray + k * 4 + 0xf0) = fVar151;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x110) = uVar1;
                        *(uint *)(ray + k * 4 + 0x120) = uVar83;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar138._4_4_ = fVar151;
                        auVar138._0_4_ = fVar151;
                        auVar138._8_4_ = fVar151;
                        auVar138._12_4_ = fVar151;
                        local_6e0 = (RTCHitN  [16])vshufps_avx(auVar202,auVar202,0x55);
                        auVar202 = vshufps_avx(auVar202,auVar202,0xaa);
                        auStack_6d0 = auVar202;
                        local_6c0 = uVar86;
                        uStack_6bc = uVar86;
                        uStack_6b8 = uVar86;
                        uStack_6b4 = uVar86;
                        local_6b0 = auVar138;
                        local_6a0 = ZEXT416(0) << 0x20;
                        local_690 = CONCAT44(uStack_6fc,local_700);
                        uStack_688 = CONCAT44(uStack_6f4,uStack_6f8);
                        local_680._4_4_ = uStack_6ec;
                        local_680._0_4_ = local_6f0;
                        local_680._8_4_ = uStack_6e8;
                        local_680._12_4_ = uStack_6e4;
                        vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                        uStack_66c = context->user->instID[0];
                        local_670 = uStack_66c;
                        uStack_668 = uStack_66c;
                        uStack_664 = uStack_66c;
                        uStack_660 = context->user->instPrimID[0];
                        uStack_65c = uStack_660;
                        uStack_658 = uStack_660;
                        uStack_654 = uStack_660;
                        *(float *)(ray + k * 4 + 0x80) = fVar115;
                        local_b20 = *local_9a8;
                        uStack_b18 = local_9a8[1];
                        local_a90.valid = (int *)&local_b20;
                        local_a90.geometryUserPtr = ((Geometry *)auVar85)->userPtr;
                        local_a90.context = context->user;
                        local_a90.hit = local_6e0;
                        local_a90.N = 4;
                        local_a90.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar85)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          local_b00 = auVar85;
                          auVar230 = ZEXT1664(auVar125);
                          auVar263 = ZEXT1664(local_9e0._0_16_);
                          auVar268 = ZEXT1664(auVar97);
                          auVar272 = ZEXT1664(auVar272._0_16_);
                          auVar276 = ZEXT1664(auVar276._0_16_);
                          (*((Geometry *)auVar85)->intersectionFilterN)(&local_a90);
                          auVar150._8_56_ = extraout_var_02;
                          auVar150._0_8_ = extraout_XMM1_Qa_00;
                          auVar138 = auVar150._0_16_;
                          auVar255 = ZEXT1664(ZEXT416((uint)fVar115));
                          auVar197 = ZEXT1664(ZEXT416((uint)fVar151));
                          auVar85 = local_b00;
                        }
                        auVar58._8_8_ = uStack_b18;
                        auVar58._0_8_ = local_b20;
                        if (auVar58 == (undefined1  [16])0x0) {
                          auVar97 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar202 = vpcmpeqd_avx(auVar138,auVar138);
                          auVar97 = auVar97 ^ auVar202;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar202 = vpcmpeqd_avx(auVar202,auVar202);
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar85)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar230 = ZEXT1664(auVar230._0_16_);
                            auVar263 = ZEXT1664(auVar263._0_16_);
                            auVar268 = ZEXT1664(auVar268._0_16_);
                            auVar272 = ZEXT1664(auVar272._0_16_);
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            (*p_Var5)(&local_a90);
                            auVar255 = ZEXT1664(ZEXT416((uint)fVar115));
                            auVar197 = ZEXT1664(ZEXT416((uint)fVar151));
                            auVar202 = vpcmpeqd_avx(auVar202,auVar202);
                          }
                          auVar59._8_8_ = uStack_b18;
                          auVar59._0_8_ = local_b20;
                          auVar158 = vpcmpeqd_avx(auVar59,_DAT_01feba10);
                          auVar97 = auVar158 ^ auVar202;
                          if (auVar59 != (undefined1  [16])0x0) {
                            auVar158 = auVar158 ^ auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])local_a90.hit);
                            *(undefined1 (*) [16])(local_a90.ray + 0xc0) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x10));
                            *(undefined1 (*) [16])(local_a90.ray + 0xd0) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x20));
                            *(undefined1 (*) [16])(local_a90.ray + 0xe0) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x30));
                            *(undefined1 (*) [16])(local_a90.ray + 0xf0) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x40));
                            *(undefined1 (*) [16])(local_a90.ray + 0x100) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x50));
                            *(undefined1 (*) [16])(local_a90.ray + 0x110) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x60));
                            *(undefined1 (*) [16])(local_a90.ray + 0x120) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x70));
                            *(undefined1 (*) [16])(local_a90.ray + 0x130) = auVar202;
                            auVar202 = vmaskmovps_avx(auVar158,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x80));
                            *(undefined1 (*) [16])(local_a90.ray + 0x140) = auVar202;
                          }
                        }
                        auVar139._8_8_ = 0x100000001;
                        auVar139._0_8_ = 0x100000001;
                        if ((auVar139 & auVar97) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar234;
                        }
                      }
                    }
                  }
                }
                auVar103 = local_5e0;
                bVar88 = lVar84 != 0;
                lVar84 = lVar84 + -1;
              } while ((!bVar48) && (bVar88));
              uVar86 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar109._4_4_ = uVar86;
              auVar109._0_4_ = uVar86;
              auVar109._8_4_ = uVar86;
              auVar109._12_4_ = uVar86;
              auVar109._16_4_ = uVar86;
              auVar109._20_4_ = uVar86;
              auVar109._24_4_ = uVar86;
              auVar109._28_4_ = uVar86;
              auVar111 = vcmpps_avx(_local_7c0,auVar109,2);
              local_5e0 = vandps_avx(auVar111,local_5e0);
              auVar103 = auVar103 & auVar111;
              uVar87 = local_600._0_8_;
            } while ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar103 >> 0x7f,0) != '\0') ||
                       (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar103 >> 0xbf,0) != '\0') ||
                     (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar103[0x1f] < '\0');
          }
          auVar148._0_4_ = (float)local_7a0._0_4_ + local_420._0_4_;
          auVar148._4_4_ = (float)local_7a0._4_4_ + local_420._4_4_;
          auVar148._8_4_ = fStack_798 + local_420._8_4_;
          auVar148._12_4_ = fStack_794 + local_420._12_4_;
          auVar148._16_4_ = fStack_790 + local_420._16_4_;
          auVar148._20_4_ = fStack_78c + local_420._20_4_;
          auVar148._24_4_ = fStack_788 + local_420._24_4_;
          auVar148._28_4_ = fStack_784 + local_420._28_4_;
          uVar86 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar195._4_4_ = uVar86;
          auVar195._0_4_ = uVar86;
          auVar195._8_4_ = uVar86;
          auVar195._12_4_ = uVar86;
          auVar195._16_4_ = uVar86;
          auVar195._20_4_ = uVar86;
          auVar195._24_4_ = uVar86;
          auVar195._28_4_ = uVar86;
          auVar111 = vcmpps_avx(auVar148,auVar195,2);
          auVar103 = vandps_avx(local_540,local_520);
          auVar103 = vandps_avx(auVar111,auVar103);
          auVar209._0_4_ = (float)local_7a0._0_4_ + local_3e0._0_4_;
          auVar209._4_4_ = (float)local_7a0._4_4_ + local_3e0._4_4_;
          auVar209._8_4_ = fStack_798 + local_3e0._8_4_;
          auVar209._12_4_ = fStack_794 + local_3e0._12_4_;
          auVar209._16_4_ = fStack_790 + local_3e0._16_4_;
          auVar209._20_4_ = fStack_78c + local_3e0._20_4_;
          auVar209._24_4_ = fStack_788 + local_3e0._24_4_;
          auVar209._28_4_ = fStack_784 + local_3e0._28_4_;
          auVar8 = vcmpps_avx(auVar209,auVar195,2);
          auVar111 = vandps_avx(local_880,_local_820);
          auVar111 = vandps_avx(auVar8,auVar111);
          auVar111 = vorps_avx(auVar103,auVar111);
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar111 >> 0x7f,0) != '\0') ||
                (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0xbf,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar111[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar81 * 0x60) = auVar111;
            auVar103 = vblendvps_avx(_local_3e0,local_420,auVar103);
            *(undefined1 (*) [32])(auStack_160 + uVar81 * 0x60) = auVar103;
            auVar61._8_8_ = uStack_8b8;
            auVar61._0_8_ = local_8c0;
            uVar2 = vmovlps_avx(auVar61);
            *(undefined8 *)(afStack_140 + uVar81 * 0x18) = uVar2;
            auStack_138[uVar81 * 0x18] = (int)uVar87 + 1;
            uVar81 = (ulong)((int)uVar81 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar81 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar102._4_4_ = uVar1;
        auVar102._0_4_ = uVar1;
        auVar102._8_4_ = uVar1;
        auVar102._12_4_ = uVar1;
        auVar97 = vcmpps_avx(local_4b0,auVar102,2);
        uVar83 = vmovmskps_avx(auVar97);
        uVar83 = (uint)local_888 & uVar83;
        if (uVar83 == 0) {
          return;
        }
        goto LAB_01637ee9;
      }
      uVar82 = (ulong)((int)uVar81 - 1);
      lVar84 = uVar82 * 0x60;
      auVar103 = *(undefined1 (*) [32])(auStack_160 + lVar84);
      auVar110._0_4_ = auVar103._0_4_ + (float)local_7a0._0_4_;
      auVar110._4_4_ = auVar103._4_4_ + (float)local_7a0._4_4_;
      auVar110._8_4_ = auVar103._8_4_ + fStack_798;
      auVar110._12_4_ = auVar103._12_4_ + fStack_794;
      auVar110._16_4_ = auVar103._16_4_ + fStack_790;
      auVar110._20_4_ = auVar103._20_4_ + fStack_78c;
      auVar110._24_4_ = auVar103._24_4_ + fStack_788;
      auVar110._28_4_ = auVar103._28_4_ + fStack_784;
      uVar86 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar196._4_4_ = uVar86;
      auVar196._0_4_ = uVar86;
      auVar196._8_4_ = uVar86;
      auVar196._12_4_ = uVar86;
      auVar196._16_4_ = uVar86;
      auVar196._20_4_ = uVar86;
      auVar196._24_4_ = uVar86;
      auVar196._28_4_ = uVar86;
      auVar8 = vcmpps_avx(auVar110,auVar196,2);
      auVar111 = vandps_avx(auVar8,*(undefined1 (*) [32])(auStack_180 + lVar84));
      _local_6e0 = auVar111;
      auVar9 = *(undefined1 (*) [32])(auStack_180 + lVar84) & auVar8;
      bVar54 = (auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar55 = (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar53 = (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar52 = SUB321(auVar9 >> 0x7f,0) == '\0';
      bVar51 = (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar50 = SUB321(auVar9 >> 0xbf,0) == '\0';
      bVar88 = (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar48 = -1 < auVar9[0x1f];
      if (((((((!bVar54 || !bVar55) || !bVar53) || !bVar52) || !bVar51) || !bVar50) || !bVar88) ||
          !bVar48) {
        auVar169._8_4_ = 0x7f800000;
        auVar169._0_8_ = 0x7f8000007f800000;
        auVar169._12_4_ = 0x7f800000;
        auVar169._16_4_ = 0x7f800000;
        auVar169._20_4_ = 0x7f800000;
        auVar169._24_4_ = 0x7f800000;
        auVar169._28_4_ = 0x7f800000;
        auVar103 = vblendvps_avx(auVar169,auVar103,auVar111);
        auVar8 = vshufps_avx(auVar103,auVar103,0xb1);
        auVar8 = vminps_avx(auVar103,auVar8);
        auVar9 = vshufpd_avx(auVar8,auVar8,5);
        auVar9 = vminps_avx(auVar8,auVar9);
        auVar8 = vpermpd_avx2(auVar9,0x4e);
        auVar9 = vminps_avx(auVar9,auVar8);
        auVar103 = vcmpps_avx(auVar103,auVar9,0);
        auVar9 = auVar111 & auVar103;
        if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar9 >> 0x7f,0) != '\0') ||
              (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0xbf,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar9[0x1f] < '\0') {
          auVar111 = vandps_avx(auVar103,auVar111);
        }
        fVar115 = afStack_140[uVar82 * 0x18 + 1];
        uVar87 = (ulong)auStack_138[uVar82 * 0x18];
        uVar79 = vmovmskps_avx(auVar111);
        iVar15 = 0;
        for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
          iVar15 = iVar15 + 1;
        }
        fVar234 = afStack_140[uVar82 * 0x18];
        auVar112._4_4_ = fVar234;
        auVar112._0_4_ = fVar234;
        auVar112._8_4_ = fVar234;
        auVar112._12_4_ = fVar234;
        auVar112._16_4_ = fVar234;
        auVar112._20_4_ = fVar234;
        auVar112._24_4_ = fVar234;
        auVar112._28_4_ = fVar234;
        *(undefined4 *)(local_6e0 + (uint)(iVar15 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar84) = _local_6e0;
        if ((((((((_local_6e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_6e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_6e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_6e0 >> 0x7f,0) != '\0') ||
              (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_6e0 >> 0xbf,0) != '\0') ||
            (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_6e0[0x1f] < '\0') {
          uVar82 = uVar81;
        }
        fVar115 = fVar115 - fVar234;
        auVar149._4_4_ = fVar115;
        auVar149._0_4_ = fVar115;
        auVar149._8_4_ = fVar115;
        auVar149._12_4_ = fVar115;
        auVar149._16_4_ = fVar115;
        auVar149._20_4_ = fVar115;
        auVar149._24_4_ = fVar115;
        auVar149._28_4_ = fVar115;
        auVar97 = vfmadd132ps_fma(auVar149,auVar112,_DAT_02020f20);
        local_420 = ZEXT1632(auVar97);
        local_8c0 = *(undefined8 *)(local_420 + (uint)(iVar15 << 2));
        uStack_8b8 = 0;
      }
      uVar81 = uVar82;
      auVar197 = ZEXT3264(auVar8);
    } while (((((((bVar54 && bVar55) && bVar53) && bVar52) && bVar51) && bVar50) && bVar88) &&
             bVar48);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }